

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  uint uVar66;
  Geometry *geometry;
  long lVar67;
  ulong uVar68;
  byte bVar69;
  float fVar70;
  float fVar71;
  float fVar117;
  float fVar119;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar118;
  float fVar120;
  float fVar122;
  float fVar123;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar121;
  float fVar124;
  float fVar125;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined4 uVar126;
  float fVar135;
  float fVar136;
  vint4 bi_2;
  undefined1 auVar127 [16];
  float fVar137;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined8 uVar138;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 ai_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar175;
  vint4 ai;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_6f0 [16];
  RTCFilterFunctionNArguments local_6c0;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  LinearSpace3fa *local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  uint local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar64 = (ulong)(byte)PVar6;
  lVar27 = uVar64 * 0x25;
  fVar150 = *(float *)(prim + lVar27 + 0x12);
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar151._0_4_ = fVar150 * auVar76._0_4_;
  auVar151._4_4_ = fVar150 * auVar76._4_4_;
  auVar151._8_4_ = fVar150 * auVar76._8_4_;
  auVar151._12_4_ = fVar150 * auVar76._12_4_;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar127._0_4_ = fVar150 * auVar75._0_4_;
  auVar127._4_4_ = fVar150 * auVar75._4_4_;
  auVar127._8_4_ = fVar150 * auVar75._8_4_;
  auVar127._12_4_ = fVar150 * auVar75._12_4_;
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar64 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar165._4_4_ = auVar127._0_4_;
  auVar165._0_4_ = auVar127._0_4_;
  auVar165._8_4_ = auVar127._0_4_;
  auVar165._12_4_ = auVar127._0_4_;
  auVar77 = vshufps_avx(auVar127,auVar127,0x55);
  auVar78 = vshufps_avx(auVar127,auVar127,0xaa);
  fVar150 = auVar78._0_4_;
  auVar145._0_4_ = fVar150 * auVar197._0_4_;
  fVar135 = auVar78._4_4_;
  auVar145._4_4_ = fVar135 * auVar197._4_4_;
  fVar136 = auVar78._8_4_;
  auVar145._8_4_ = fVar136 * auVar197._8_4_;
  fVar137 = auVar78._12_4_;
  auVar145._12_4_ = fVar137 * auVar197._12_4_;
  auVar139._0_4_ = auVar22._0_4_ * fVar150;
  auVar139._4_4_ = auVar22._4_4_ * fVar135;
  auVar139._8_4_ = auVar22._8_4_ * fVar136;
  auVar139._12_4_ = auVar22._12_4_ * fVar137;
  auVar128._0_4_ = auVar25._0_4_ * fVar150;
  auVar128._4_4_ = auVar25._4_4_ * fVar135;
  auVar128._8_4_ = auVar25._8_4_ * fVar136;
  auVar128._12_4_ = auVar25._12_4_ * fVar137;
  auVar78 = vfmadd231ps_fma(auVar145,auVar77,auVar75);
  auVar29 = vfmadd231ps_fma(auVar139,auVar77,auVar21);
  auVar77 = vfmadd231ps_fma(auVar128,auVar24,auVar77);
  auVar30 = vfmadd231ps_fma(auVar78,auVar165,auVar76);
  auVar29 = vfmadd231ps_fma(auVar29,auVar165,auVar196);
  auVar79 = vfmadd231ps_fma(auVar77,auVar23,auVar165);
  auVar188._4_4_ = auVar151._0_4_;
  auVar188._0_4_ = auVar151._0_4_;
  auVar188._8_4_ = auVar151._0_4_;
  auVar188._12_4_ = auVar151._0_4_;
  auVar77 = vshufps_avx(auVar151,auVar151,0x55);
  auVar78 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar150 = auVar78._0_4_;
  auVar166._0_4_ = fVar150 * auVar197._0_4_;
  fVar135 = auVar78._4_4_;
  auVar166._4_4_ = fVar135 * auVar197._4_4_;
  fVar136 = auVar78._8_4_;
  auVar166._8_4_ = fVar136 * auVar197._8_4_;
  fVar137 = auVar78._12_4_;
  auVar166._12_4_ = fVar137 * auVar197._12_4_;
  auVar157._0_4_ = auVar22._0_4_ * fVar150;
  auVar157._4_4_ = auVar22._4_4_ * fVar135;
  auVar157._8_4_ = auVar22._8_4_ * fVar136;
  auVar157._12_4_ = auVar22._12_4_ * fVar137;
  auVar152._0_4_ = auVar25._0_4_ * fVar150;
  auVar152._4_4_ = auVar25._4_4_ * fVar135;
  auVar152._8_4_ = auVar25._8_4_ * fVar136;
  auVar152._12_4_ = auVar25._12_4_ * fVar137;
  auVar75 = vfmadd231ps_fma(auVar166,auVar77,auVar75);
  auVar197 = vfmadd231ps_fma(auVar157,auVar77,auVar21);
  auVar21 = vfmadd231ps_fma(auVar152,auVar77,auVar24);
  auVar31 = vfmadd231ps_fma(auVar75,auVar188,auVar76);
  auVar127 = vfmadd231ps_fma(auVar197,auVar188,auVar196);
  auVar179._8_4_ = 0x7fffffff;
  auVar179._0_8_ = 0x7fffffff7fffffff;
  auVar179._12_4_ = 0x7fffffff;
  auVar128 = vfmadd231ps_fma(auVar21,auVar188,auVar23);
  auVar76 = vandps_avx(auVar179,auVar30);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar76,auVar176,1);
  bVar13 = (bool)((byte)uVar68 & 1);
  auVar72._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._0_4_;
  bVar13 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._4_4_;
  bVar13 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._8_4_;
  bVar13 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar30._12_4_;
  auVar76 = vandps_avx(auVar179,auVar29);
  uVar68 = vcmpps_avx512vl(auVar76,auVar176,1);
  bVar13 = (bool)((byte)uVar68 & 1);
  auVar73._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._0_4_;
  bVar13 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._4_4_;
  bVar13 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._8_4_;
  bVar13 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._12_4_;
  auVar76 = vandps_avx(auVar179,auVar79);
  uVar68 = vcmpps_avx512vl(auVar76,auVar176,1);
  bVar13 = (bool)((byte)uVar68 & 1);
  auVar74._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar79._0_4_;
  bVar13 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar79._4_4_;
  bVar13 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar79._8_4_;
  bVar13 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar79._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar72);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar72,auVar75,auVar177);
  auVar30 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar76 = vfnmadd213ps_fma(auVar73,auVar75,auVar177);
  auVar79 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar76 = vfnmadd213ps_fma(auVar74,auVar75,auVar177);
  auVar28 = vfmadd132ps_fma(auVar76,auVar75,auVar75);
  fVar150 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar173._4_4_ = fVar150;
  auVar173._0_4_ = fVar150;
  auVar173._8_4_ = fVar150;
  auVar173._12_4_ = fVar150;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar76 = vpmovsxwd_avx(auVar76);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar196 = vsubps_avx(auVar75,auVar76);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar197);
  auVar197 = vfmadd213ps_fma(auVar196,auVar173,auVar76);
  auVar76 = vcvtdq2ps_avx(auVar75);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar75 = vpmovsxwd_avx(auVar196);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar196 = vfmadd213ps_fma(auVar75,auVar173,auVar76);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar76 = vpmovsxwd_avx(auVar21);
  auVar76 = vcvtdq2ps_avx(auVar76);
  uVar68 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar68 + 6);
  auVar75 = vpmovsxwd_avx(auVar22);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar21 = vfmadd213ps_fma(auVar75,auVar173,auVar76);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar76 = vpmovsxwd_avx(auVar23);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar75 = vpmovsxwd_avx(auVar24);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar22 = vfmadd213ps_fma(auVar75,auVar173,auVar76);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar76 = vpmovsxwd_avx(auVar25);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar23 = vfmadd213ps_fma(auVar75,auVar173,auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar64) + 6);
  auVar76 = vpmovsxwd_avx(auVar78);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar75 = vpmovsxwd_avx(auVar29);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar76);
  auVar75 = vfmadd213ps_fma(auVar75,auVar173,auVar76);
  auVar76 = vsubps_avx(auVar197,auVar31);
  auVar174._0_4_ = auVar30._0_4_ * auVar76._0_4_;
  auVar174._4_4_ = auVar30._4_4_ * auVar76._4_4_;
  auVar174._8_4_ = auVar30._8_4_ * auVar76._8_4_;
  auVar174._12_4_ = auVar30._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar196,auVar31);
  auVar146._0_4_ = auVar30._0_4_ * auVar76._0_4_;
  auVar146._4_4_ = auVar30._4_4_ * auVar76._4_4_;
  auVar146._8_4_ = auVar30._8_4_ * auVar76._8_4_;
  auVar146._12_4_ = auVar30._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar21,auVar127);
  auVar167._0_4_ = auVar79._0_4_ * auVar76._0_4_;
  auVar167._4_4_ = auVar79._4_4_ * auVar76._4_4_;
  auVar167._8_4_ = auVar79._8_4_ * auVar76._8_4_;
  auVar167._12_4_ = auVar79._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar22,auVar127);
  auVar140._0_4_ = auVar79._0_4_ * auVar76._0_4_;
  auVar140._4_4_ = auVar79._4_4_ * auVar76._4_4_;
  auVar140._8_4_ = auVar79._8_4_ * auVar76._8_4_;
  auVar140._12_4_ = auVar79._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar23,auVar128);
  auVar158._0_4_ = auVar28._0_4_ * auVar76._0_4_;
  auVar158._4_4_ = auVar28._4_4_ * auVar76._4_4_;
  auVar158._8_4_ = auVar28._8_4_ * auVar76._8_4_;
  auVar158._12_4_ = auVar28._12_4_ * auVar76._12_4_;
  auVar76 = vsubps_avx(auVar75,auVar128);
  auVar129._0_4_ = auVar28._0_4_ * auVar76._0_4_;
  auVar129._4_4_ = auVar28._4_4_ * auVar76._4_4_;
  auVar129._8_4_ = auVar28._8_4_ * auVar76._8_4_;
  auVar129._12_4_ = auVar28._12_4_ * auVar76._12_4_;
  auVar76 = vpminsd_avx(auVar174,auVar146);
  auVar75 = vpminsd_avx(auVar167,auVar140);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar75 = vpminsd_avx(auVar158,auVar129);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar30._4_4_ = uVar126;
  auVar30._0_4_ = uVar126;
  auVar30._8_4_ = uVar126;
  auVar30._12_4_ = uVar126;
  auVar75 = vmaxps_avx512vl(auVar75,auVar30);
  auVar76 = vmaxps_avx(auVar76,auVar75);
  auVar79._8_4_ = 0x3f7ffffa;
  auVar79._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar79._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar76,auVar79);
  auVar76 = vpmaxsd_avx(auVar174,auVar146);
  auVar75 = vpmaxsd_avx(auVar167,auVar140);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar75 = vpmaxsd_avx(auVar158,auVar129);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar28._4_4_ = uVar126;
  auVar28._0_4_ = uVar126;
  auVar28._8_4_ = uVar126;
  auVar28._12_4_ = uVar126;
  auVar75 = vminps_avx512vl(auVar75,auVar28);
  auVar76 = vminps_avx(auVar76,auVar75);
  auVar31._8_4_ = 0x3f800003;
  auVar31._0_8_ = 0x3f8000033f800003;
  auVar31._12_4_ = 0x3f800003;
  auVar76 = vmulps_avx512vl(auVar76,auVar31);
  auVar75 = vpbroadcastd_avx512vl();
  uVar138 = vcmpps_avx512vl(local_3d0,auVar76,2);
  uVar68 = vpcmpgtd_avx512vl(auVar75,_DAT_01f7fcf0);
  uVar68 = ((byte)uVar138 & 0xf) & uVar68;
  if ((char)uVar68 == '\0') {
    bVar69 = 0;
  }
  else {
    local_628 = pre->ray_space + k;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar27 = 0;
      for (uVar64 = uVar68; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar7 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6));
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar150 = (pGVar9->time_range).lower;
      fVar150 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar150) / ((pGVar9->time_range).upper - fVar150)
                );
      auVar76 = vroundss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),9);
      auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
      fVar150 = fVar150 - auVar76._0_4_;
      fVar135 = 1.0 - fVar150;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar63 = (long)(int)auVar76._0_4_ * 0x38;
      lVar27 = *(long *)(_Var10 + 0x10 + lVar63);
      lVar67 = *(long *)(_Var10 + 0x38 + lVar63);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar63);
      auVar130._4_4_ = fVar150;
      auVar130._0_4_ = fVar150;
      auVar130._8_4_ = fVar150;
      auVar130._12_4_ = fVar150;
      pfVar3 = (float *)(lVar67 + lVar11 * uVar62);
      auVar180._0_4_ = fVar150 * *pfVar3;
      auVar180._4_4_ = fVar150 * pfVar3[1];
      auVar180._8_4_ = fVar150 * pfVar3[2];
      auVar180._12_4_ = fVar150 * pfVar3[3];
      uVar64 = uVar62 + 1;
      auVar76 = vmulps_avx512vl(auVar130,*(undefined1 (*) [16])(lVar67 + lVar11 * uVar64));
      p_Var12 = pGVar9[4].occlusionFilterN;
      auVar141._4_4_ = fVar135;
      auVar141._0_4_ = fVar135;
      auVar141._8_4_ = fVar135;
      auVar141._12_4_ = fVar135;
      local_670 = vfmadd231ps_fma(auVar180,auVar141,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var10 + lVar63) + lVar27 * uVar62));
      _local_490 = vfmadd231ps_avx512vl
                             (auVar76,auVar141,
                              *(undefined1 (*) [16])(*(long *)(_Var10 + lVar63) + lVar27 * uVar64));
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar63 + 0x38) +
                        uVar62 * *(long *)(p_Var12 + lVar63 + 0x48));
      auVar181._0_4_ = fVar150 * *pfVar3;
      auVar181._4_4_ = fVar150 * pfVar3[1];
      auVar181._8_4_ = fVar150 * pfVar3[2];
      auVar181._12_4_ = fVar150 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar63 + 0x38) +
                        *(long *)(p_Var12 + lVar63 + 0x48) * uVar64);
      auVar184._0_4_ = fVar150 * *pfVar3;
      auVar184._4_4_ = fVar150 * pfVar3[1];
      auVar184._8_4_ = fVar150 * pfVar3[2];
      auVar184._12_4_ = fVar150 * pfVar3[3];
      auVar75 = vfmadd231ps_fma(auVar181,auVar141,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar63) +
                                 *(long *)(p_Var12 + lVar63 + 0x10) * uVar62));
      auVar197 = vfmadd231ps_fma(auVar184,auVar141,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var12 + lVar63) +
                                  *(long *)(p_Var12 + lVar63 + 0x10) * uVar64));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      lVar27 = (long)iVar8 * 0x44;
      auVar142._8_4_ = 0xbeaaaaab;
      auVar142._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar142._12_4_ = 0xbeaaaaab;
      local_680 = vfnmadd213ps_fma(auVar75,auVar142,local_670);
      local_690 = vfmadd213ps_avx512vl(auVar197,auVar142,_local_490);
      auVar197 = vsubps_avx(local_670,auVar76);
      uVar126 = auVar197._0_4_;
      auVar147._4_4_ = uVar126;
      auVar147._0_4_ = uVar126;
      auVar147._8_4_ = uVar126;
      auVar147._12_4_ = uVar126;
      auVar75 = vshufps_avx(auVar197,auVar197,0x55);
      aVar4 = (local_628->vx).field_0;
      aVar5 = (local_628->vy).field_0;
      fVar150 = (local_628->vz).field_0.m128[0];
      fVar135 = *(float *)((long)&(local_628->vz).field_0 + 4);
      fVar136 = *(float *)((long)&(local_628->vz).field_0 + 8);
      fVar137 = *(float *)((long)&(local_628->vz).field_0 + 0xc);
      auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
      auVar183._0_4_ = fVar150 * auVar197._0_4_;
      auVar183._4_4_ = fVar135 * auVar197._4_4_;
      auVar183._8_4_ = fVar136 * auVar197._8_4_;
      auVar183._12_4_ = fVar137 * auVar197._12_4_;
      auVar75 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar75);
      auVar196 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar147);
      auVar197 = vsubps_avx(local_680,auVar76);
      uVar126 = auVar197._0_4_;
      auVar148._4_4_ = uVar126;
      auVar148._0_4_ = uVar126;
      auVar148._8_4_ = uVar126;
      auVar148._12_4_ = uVar126;
      auVar75 = vshufps_avx(auVar197,auVar197,0x55);
      auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
      auVar185._0_4_ = fVar150 * auVar197._0_4_;
      auVar185._4_4_ = fVar135 * auVar197._4_4_;
      auVar185._8_4_ = fVar136 * auVar197._8_4_;
      auVar185._12_4_ = fVar137 * auVar197._12_4_;
      auVar75 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar75);
      auVar21 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar148);
      auVar197 = vsubps_avx(local_690,auVar76);
      uVar126 = auVar197._0_4_;
      auVar149._4_4_ = uVar126;
      auVar149._0_4_ = uVar126;
      auVar149._8_4_ = uVar126;
      auVar149._12_4_ = uVar126;
      auVar75 = vshufps_avx(auVar197,auVar197,0x55);
      auVar197 = vshufps_avx(auVar197,auVar197,0xaa);
      auVar186._0_4_ = fVar150 * auVar197._0_4_;
      auVar186._4_4_ = fVar135 * auVar197._4_4_;
      auVar186._8_4_ = fVar136 * auVar197._8_4_;
      auVar186._12_4_ = fVar137 * auVar197._12_4_;
      auVar75 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar75);
      auVar197 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar149);
      auVar75 = vsubps_avx512vl(_local_490,auVar76);
      uVar126 = auVar75._0_4_;
      auVar143._4_4_ = uVar126;
      auVar143._0_4_ = uVar126;
      auVar143._8_4_ = uVar126;
      auVar143._12_4_ = uVar126;
      auVar76 = vshufps_avx(auVar75,auVar75,0x55);
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      auVar190._0_4_ = fVar150 * auVar75._0_4_;
      auVar190._4_4_ = fVar135 * auVar75._4_4_;
      auVar190._8_4_ = fVar136 * auVar75._8_4_;
      auVar190._12_4_ = fVar137 * auVar75._12_4_;
      auVar76 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar5,auVar76);
      auVar22 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar4,auVar143);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar126 = auVar196._0_4_;
      local_580._4_4_ = uVar126;
      local_580._0_4_ = uVar126;
      local_580._8_4_ = uVar126;
      local_580._12_4_ = uVar126;
      local_580._16_4_ = uVar126;
      local_580._20_4_ = uVar126;
      local_580._24_4_ = uVar126;
      local_580._28_4_ = uVar126;
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar80._8_4_ = 1;
      auVar80._0_8_ = 0x100000001;
      auVar80._12_4_ = 1;
      auVar80._16_4_ = 1;
      auVar80._20_4_ = 1;
      auVar80._24_4_ = 1;
      auVar80._28_4_ = 1;
      local_4e0 = vpermps_avx2(auVar80,ZEXT1632(auVar196));
      uVar126 = auVar21._0_4_;
      local_5a0._4_4_ = uVar126;
      local_5a0._0_4_ = uVar126;
      local_5a0._8_4_ = uVar126;
      local_5a0._12_4_ = uVar126;
      local_5a0._16_4_ = uVar126;
      local_5a0._20_4_ = uVar126;
      local_5a0._24_4_ = uVar126;
      local_5a0._28_4_ = uVar126;
      local_500 = vpermps_avx512vl(auVar80,ZEXT1632(auVar21));
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_5c0 = vbroadcastss_avx512vl(auVar197);
      local_5e0 = vpermps_avx512vl(auVar80,ZEXT1632(auVar197));
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      uVar126 = auVar22._0_4_;
      local_520._4_4_ = uVar126;
      local_520._0_4_ = uVar126;
      local_520._8_4_ = uVar126;
      local_520._12_4_ = uVar126;
      local_520._16_4_ = uVar126;
      local_520._20_4_ = uVar126;
      local_520._24_4_ = uVar126;
      local_520._28_4_ = uVar126;
      local_540 = vpermps_avx512vl(auVar80,ZEXT1632(auVar22));
      auVar80 = vmulps_avx512vl(local_520,auVar92);
      auVar81 = vmulps_avx512vl(local_540,auVar92);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar93,local_5c0);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar93,local_5e0);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,local_5a0);
      auVar82 = vfmadd231ps_avx512vl(auVar81,auVar97,local_500);
      auVar83 = vfmadd231ps_avx512vl(auVar80,auVar95,local_580);
      auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar81 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar84 = vfmadd231ps_avx512vl(auVar82,auVar95,local_4e0);
      auVar82 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar205 = ZEXT3264(local_520);
      auVar85 = vmulps_avx512vl(local_520,auVar82);
      auVar206 = ZEXT3264(local_540);
      auVar86 = vmulps_avx512vl(local_540,auVar82);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,local_5c0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,local_5e0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,local_5a0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,local_500);
      auVar23 = vfmadd231ps_fma(auVar85,auVar80,local_580);
      auVar24 = vfmadd231ps_fma(auVar86,auVar80,local_4e0);
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar23),auVar83);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar24),auVar84);
      auVar85 = vmulps_avx512vl(auVar84,auVar86);
      auVar88 = vmulps_avx512vl(auVar83,auVar87);
      auVar85 = vsubps_avx512vl(auVar85,auVar88);
      auVar76 = vshufps_avx(local_670,local_670,0xff);
      uVar138 = auVar76._0_8_;
      local_80._8_8_ = uVar138;
      local_80._0_8_ = uVar138;
      local_80._16_8_ = uVar138;
      local_80._24_8_ = uVar138;
      auVar76 = vshufps_avx(local_680,local_680,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar76);
      auVar76 = vshufps_avx(local_690,local_690,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar76);
      auVar76 = vshufps_avx512vl(_local_490,_local_490,0xff);
      uVar138 = auVar76._0_8_;
      register0x000012c8 = uVar138;
      local_e0 = uVar138;
      register0x000012d0 = uVar138;
      register0x000012d8 = uVar138;
      auVar88 = vmulps_avx512vl(_local_e0,auVar92);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar97,local_a0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,local_80);
      auVar89 = vmulps_avx512vl(_local_e0,auVar82);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,local_c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar81,local_a0);
      auVar25 = vfmadd231ps_fma(auVar89,auVar80,local_80);
      auVar89 = vmulps_avx512vl(auVar87,auVar87);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar86);
      auVar90 = vmaxps_avx512vl(auVar88,ZEXT1632(auVar25));
      auVar90 = vmulps_avx512vl(auVar90,auVar90);
      auVar89 = vmulps_avx512vl(auVar90,auVar89);
      auVar85 = vmulps_avx512vl(auVar85,auVar85);
      uVar138 = vcmpps_avx512vl(auVar85,auVar89,2);
      auVar76 = vblendps_avx(auVar196,local_670,8);
      auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar75 = vandps_avx512vl(auVar76,auVar77);
      auVar76 = vblendps_avx(auVar21,local_680,8);
      auVar76 = vandps_avx512vl(auVar76,auVar77);
      auVar75 = vmaxps_avx(auVar75,auVar76);
      auVar76 = vblendps_avx(auVar197,local_690,8);
      auVar78 = vandps_avx512vl(auVar76,auVar77);
      auVar76 = vblendps_avx(auVar22,_local_490,8);
      auVar76 = vandps_avx512vl(auVar76,auVar77);
      auVar76 = vmaxps_avx(auVar78,auVar76);
      auVar76 = vmaxps_avx(auVar75,auVar76);
      auVar75 = vmovshdup_avx(auVar76);
      auVar75 = vmaxss_avx(auVar75,auVar76);
      auVar76 = vshufpd_avx(auVar76,auVar76,1);
      auVar76 = vmaxss_avx(auVar76,auVar75);
      auVar75 = vcvtsi2ss_avx512f(_local_490,iVar8);
      local_460._0_16_ = auVar75;
      auVar89._0_4_ = auVar75._0_4_;
      auVar89._4_4_ = auVar89._0_4_;
      auVar89._8_4_ = auVar89._0_4_;
      auVar89._12_4_ = auVar89._0_4_;
      auVar89._16_4_ = auVar89._0_4_;
      auVar89._20_4_ = auVar89._0_4_;
      auVar89._24_4_ = auVar89._0_4_;
      auVar89._28_4_ = auVar89._0_4_;
      uVar26 = vcmpps_avx512vl(auVar89,_DAT_01faff40,0xe);
      bVar69 = (byte)uVar138 & (byte)uVar26;
      auVar76 = vmulss_avx512f(auVar76,ZEXT416(0x35000000));
      auVar85._8_4_ = 2;
      auVar85._0_8_ = 0x200000002;
      auVar85._12_4_ = 2;
      auVar85._16_4_ = 2;
      auVar85._20_4_ = 2;
      auVar85._24_4_ = 2;
      auVar85._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar85,ZEXT1632(auVar196));
      local_120 = vpermps_avx512vl(auVar85,ZEXT1632(auVar21));
      local_140 = vpermps_avx512vl(auVar85,ZEXT1632(auVar197));
      auVar85 = vpermps_avx2(auVar85,ZEXT1632(auVar22));
      uVar66 = *(uint *)(ray + k * 4 + 0x60);
      auVar75 = local_100._0_16_;
      if (bVar69 == 0) {
        uVar64 = 0;
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar195 = ZEXT3264(auVar95);
        auVar75 = vxorps_avx512vl(auVar75,auVar75);
        auVar198 = ZEXT1664(auVar75);
        auVar199 = ZEXT3264(local_580);
        auVar200 = ZEXT3264(local_4e0);
        auVar201 = ZEXT3264(local_5a0);
        auVar202 = ZEXT3264(local_500);
        auVar203 = ZEXT3264(local_5c0);
        auVar204 = ZEXT3264(local_5e0);
      }
      else {
        local_620._0_16_ = ZEXT416(uVar66);
        auVar82 = vmulps_avx512vl(auVar85,auVar82);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar82);
        auVar81 = vfmadd213ps_avx512vl(auVar81,local_120,auVar91);
        auVar90 = vfmadd213ps_avx512vl(auVar80,local_100,auVar81);
        auVar92 = vmulps_avx512vl(auVar85,auVar92);
        auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
        auVar81 = vfmadd213ps_avx512vl(auVar97,local_120,auVar93);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar80 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar94 = vfmadd213ps_avx512vl(auVar95,local_100,auVar81);
        auVar95 = vmulps_avx512vl(local_520,auVar80);
        auVar81 = vmulps_avx512vl(local_540,auVar80);
        auVar187._0_4_ = auVar85._0_4_ * auVar80._0_4_;
        auVar187._4_4_ = auVar85._4_4_ * auVar80._4_4_;
        auVar187._8_4_ = auVar85._8_4_ * auVar80._8_4_;
        auVar187._12_4_ = auVar85._12_4_ * auVar80._12_4_;
        auVar187._16_4_ = auVar85._16_4_ * auVar80._16_4_;
        auVar187._20_4_ = auVar85._20_4_ * auVar80._20_4_;
        auVar187._24_4_ = auVar85._24_4_ * auVar80._24_4_;
        auVar187._28_4_ = 0;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_5c0);
        auVar80 = vfmadd231ps_avx512vl(auVar81,auVar92,local_5e0);
        auVar92 = vfmadd231ps_avx512vl(auVar187,local_140,auVar92);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_5a0);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar93,local_500);
        auVar81 = vfmadd231ps_avx512vl(auVar92,local_120,auVar93);
        auVar91 = vfmadd231ps_avx512vl(auVar95,auVar97,local_580);
        auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,local_4e0);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar81 = vfmadd231ps_avx512vl(auVar81,local_100,auVar97);
        auVar82 = vmulps_avx512vl(local_520,auVar92);
        auVar96 = vmulps_avx512vl(local_540,auVar92);
        auVar97._4_4_ = auVar85._4_4_ * auVar92._4_4_;
        auVar97._0_4_ = auVar85._0_4_ * auVar92._0_4_;
        auVar97._8_4_ = auVar85._8_4_ * auVar92._8_4_;
        auVar97._12_4_ = auVar85._12_4_ * auVar92._12_4_;
        auVar97._16_4_ = auVar85._16_4_ * auVar92._16_4_;
        auVar97._20_4_ = auVar85._20_4_ * auVar92._20_4_;
        auVar97._24_4_ = auVar85._24_4_ * auVar92._24_4_;
        auVar97._28_4_ = auVar92._28_4_;
        auVar92 = vfmadd231ps_avx512vl(auVar82,auVar93,local_5c0);
        auVar82 = vfmadd231ps_avx512vl(auVar96,auVar93,local_5e0);
        auVar93 = vfmadd231ps_avx512vl(auVar97,local_140,auVar93);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,local_5a0);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar97,local_500);
        auVar97 = vfmadd231ps_avx512vl(auVar93,local_120,auVar97);
        auVar93 = vfmadd231ps_avx512vl(auVar92,auVar95,local_580);
        auVar92 = vfmadd231ps_avx512vl(auVar82,auVar95,local_4e0);
        auVar82 = vfmadd231ps_avx512vl(auVar97,local_100,auVar95);
        auVar191._8_4_ = 0x7fffffff;
        auVar191._0_8_ = 0x7fffffff7fffffff;
        auVar191._12_4_ = 0x7fffffff;
        auVar191._16_4_ = 0x7fffffff;
        auVar191._20_4_ = 0x7fffffff;
        auVar191._24_4_ = 0x7fffffff;
        auVar191._28_4_ = 0x7fffffff;
        auVar95 = vandps_avx(auVar91,auVar191);
        auVar97 = vandps_avx(auVar80,auVar191);
        auVar97 = vmaxps_avx(auVar95,auVar97);
        auVar95 = vandps_avx(auVar81,auVar191);
        auVar95 = vmaxps_avx(auVar97,auVar95);
        auVar81 = vbroadcastss_avx512vl(auVar76);
        uVar62 = vcmpps_avx512vl(auVar95,auVar81,1);
        bVar13 = (bool)((byte)uVar62 & 1);
        auVar96._0_4_ = (float)((uint)bVar13 * auVar86._0_4_ | (uint)!bVar13 * auVar91._0_4_);
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar13 * auVar86._4_4_ | (uint)!bVar13 * auVar91._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar13 * auVar86._8_4_ | (uint)!bVar13 * auVar91._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar13 * auVar86._12_4_ | (uint)!bVar13 * auVar91._12_4_);
        bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar96._16_4_ = (float)((uint)bVar13 * auVar86._16_4_ | (uint)!bVar13 * auVar91._16_4_);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar96._20_4_ = (float)((uint)bVar13 * auVar86._20_4_ | (uint)!bVar13 * auVar91._20_4_);
        bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar96._24_4_ = (float)((uint)bVar13 * auVar86._24_4_ | (uint)!bVar13 * auVar91._24_4_);
        bVar13 = SUB81(uVar62 >> 7,0);
        auVar96._28_4_ = (uint)bVar13 * auVar86._28_4_ | (uint)!bVar13 * auVar91._28_4_;
        bVar13 = (bool)((byte)uVar62 & 1);
        auVar98._0_4_ = (float)((uint)bVar13 * auVar87._0_4_ | (uint)!bVar13 * auVar80._0_4_);
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * auVar80._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * auVar80._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * auVar80._12_4_);
        bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar13 * auVar87._16_4_ | (uint)!bVar13 * auVar80._16_4_);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar13 * auVar87._20_4_ | (uint)!bVar13 * auVar80._20_4_);
        bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar13 * auVar87._24_4_ | (uint)!bVar13 * auVar80._24_4_);
        bVar13 = SUB81(uVar62 >> 7,0);
        auVar98._28_4_ = (uint)bVar13 * auVar87._28_4_ | (uint)!bVar13 * auVar80._28_4_;
        auVar95 = vandps_avx(auVar191,auVar93);
        auVar97 = vandps_avx(auVar92,auVar191);
        auVar97 = vmaxps_avx(auVar95,auVar97);
        auVar95 = vandps_avx(auVar82,auVar191);
        auVar95 = vmaxps_avx(auVar97,auVar95);
        uVar62 = vcmpps_avx512vl(auVar95,auVar81,1);
        bVar13 = (bool)((byte)uVar62 & 1);
        auVar99._0_4_ = (float)((uint)bVar13 * auVar86._0_4_ | (uint)!bVar13 * auVar93._0_4_);
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar13 * auVar86._4_4_ | (uint)!bVar13 * auVar93._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar13 * auVar86._8_4_ | (uint)!bVar13 * auVar93._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar13 * auVar86._12_4_ | (uint)!bVar13 * auVar93._12_4_);
        bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar13 * auVar86._16_4_ | (uint)!bVar13 * auVar93._16_4_);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar13 * auVar86._20_4_ | (uint)!bVar13 * auVar93._20_4_);
        bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar13 * auVar86._24_4_ | (uint)!bVar13 * auVar93._24_4_);
        bVar13 = SUB81(uVar62 >> 7,0);
        auVar99._28_4_ = (uint)bVar13 * auVar86._28_4_ | (uint)!bVar13 * auVar93._28_4_;
        bVar13 = (bool)((byte)uVar62 & 1);
        auVar100._0_4_ = (float)((uint)bVar13 * auVar87._0_4_ | (uint)!bVar13 * auVar92._0_4_);
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * auVar92._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * auVar92._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * auVar92._12_4_);
        bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar13 * auVar87._16_4_ | (uint)!bVar13 * auVar92._16_4_);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar13 * auVar87._20_4_ | (uint)!bVar13 * auVar92._20_4_);
        bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar13 * auVar87._24_4_ | (uint)!bVar13 * auVar92._24_4_);
        bVar13 = SUB81(uVar62 >> 7,0);
        auVar100._28_4_ = (uint)bVar13 * auVar87._28_4_ | (uint)!bVar13 * auVar92._28_4_;
        auVar79 = vxorps_avx512vl(auVar75,auVar75);
        auVar198 = ZEXT1664(auVar79);
        auVar95 = vfmadd213ps_avx512vl(auVar96,auVar96,ZEXT1632(auVar79));
        auVar75 = vfmadd231ps_fma(auVar95,auVar98,auVar98);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar150 = auVar97._0_4_;
        fVar135 = auVar97._4_4_;
        fVar136 = auVar97._8_4_;
        fVar137 = auVar97._12_4_;
        fVar172 = auVar97._16_4_;
        fVar175 = auVar97._20_4_;
        fVar70 = auVar97._24_4_;
        auVar95._4_4_ = fVar135 * fVar135 * fVar135 * auVar75._4_4_ * -0.5;
        auVar95._0_4_ = fVar150 * fVar150 * fVar150 * auVar75._0_4_ * -0.5;
        auVar95._8_4_ = fVar136 * fVar136 * fVar136 * auVar75._8_4_ * -0.5;
        auVar95._12_4_ = fVar137 * fVar137 * fVar137 * auVar75._12_4_ * -0.5;
        auVar95._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar95._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar95._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
        auVar95._28_4_ = auVar82._28_4_;
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar80,auVar97);
        auVar93._4_4_ = auVar98._4_4_ * auVar95._4_4_;
        auVar93._0_4_ = auVar98._0_4_ * auVar95._0_4_;
        auVar93._8_4_ = auVar98._8_4_ * auVar95._8_4_;
        auVar93._12_4_ = auVar98._12_4_ * auVar95._12_4_;
        auVar93._16_4_ = auVar98._16_4_ * auVar95._16_4_;
        auVar93._20_4_ = auVar98._20_4_ * auVar95._20_4_;
        auVar93._24_4_ = auVar98._24_4_ * auVar95._24_4_;
        auVar93._28_4_ = 0;
        auVar92._4_4_ = auVar95._4_4_ * -auVar96._4_4_;
        auVar92._0_4_ = auVar95._0_4_ * -auVar96._0_4_;
        auVar92._8_4_ = auVar95._8_4_ * -auVar96._8_4_;
        auVar92._12_4_ = auVar95._12_4_ * -auVar96._12_4_;
        auVar92._16_4_ = auVar95._16_4_ * -auVar96._16_4_;
        auVar92._20_4_ = auVar95._20_4_ * -auVar96._20_4_;
        auVar92._24_4_ = auVar95._24_4_ * -auVar96._24_4_;
        auVar92._28_4_ = auVar98._28_4_;
        auVar95 = vmulps_avx512vl(auVar95,ZEXT1632(auVar79));
        auVar86 = ZEXT1632(auVar79);
        auVar97 = vfmadd213ps_avx512vl(auVar99,auVar99,auVar86);
        auVar75 = vfmadd231ps_fma(auVar97,auVar100,auVar100);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar150 = auVar97._0_4_;
        fVar135 = auVar97._4_4_;
        fVar136 = auVar97._8_4_;
        fVar137 = auVar97._12_4_;
        fVar172 = auVar97._16_4_;
        fVar175 = auVar97._20_4_;
        fVar70 = auVar97._24_4_;
        auVar81._4_4_ = fVar135 * fVar135 * fVar135 * auVar75._4_4_ * -0.5;
        auVar81._0_4_ = fVar150 * fVar150 * fVar150 * auVar75._0_4_ * -0.5;
        auVar81._8_4_ = fVar136 * fVar136 * fVar136 * auVar75._8_4_ * -0.5;
        auVar81._12_4_ = fVar137 * fVar137 * fVar137 * auVar75._12_4_ * -0.5;
        auVar81._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
        auVar81._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar81._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
        auVar81._28_4_ = 0;
        auVar80 = vfmadd231ps_avx512vl(auVar81,auVar80,auVar97);
        auVar91._4_4_ = auVar100._4_4_ * auVar80._4_4_;
        auVar91._0_4_ = auVar100._0_4_ * auVar80._0_4_;
        auVar91._8_4_ = auVar100._8_4_ * auVar80._8_4_;
        auVar91._12_4_ = auVar100._12_4_ * auVar80._12_4_;
        auVar91._16_4_ = auVar100._16_4_ * auVar80._16_4_;
        auVar91._20_4_ = auVar100._20_4_ * auVar80._20_4_;
        auVar91._24_4_ = auVar100._24_4_ * auVar80._24_4_;
        auVar91._28_4_ = auVar97._28_4_;
        auVar82._4_4_ = -auVar99._4_4_ * auVar80._4_4_;
        auVar82._0_4_ = -auVar99._0_4_ * auVar80._0_4_;
        auVar82._8_4_ = -auVar99._8_4_ * auVar80._8_4_;
        auVar82._12_4_ = -auVar99._12_4_ * auVar80._12_4_;
        auVar82._16_4_ = -auVar99._16_4_ * auVar80._16_4_;
        auVar82._20_4_ = -auVar99._20_4_ * auVar80._20_4_;
        auVar82._24_4_ = -auVar99._24_4_ * auVar80._24_4_;
        auVar82._28_4_ = auVar99._28_4_ ^ 0x80000000;
        auVar97 = vmulps_avx512vl(auVar80,auVar86);
        auVar75 = vfmadd213ps_fma(auVar93,auVar88,auVar83);
        auVar197 = vfmadd213ps_fma(auVar92,auVar88,auVar84);
        auVar80 = vfmadd213ps_avx512vl(auVar95,auVar88,auVar94);
        auVar81 = vfmadd213ps_avx512vl(auVar91,ZEXT1632(auVar25),ZEXT1632(auVar23));
        auVar77 = vfnmadd213ps_fma(auVar93,auVar88,auVar83);
        auVar83 = ZEXT1632(auVar25);
        auVar196 = vfmadd213ps_fma(auVar82,auVar83,ZEXT1632(auVar24));
        auVar78 = vfnmadd213ps_fma(auVar92,auVar88,auVar84);
        auVar21 = vfmadd213ps_fma(auVar97,auVar83,auVar90);
        auVar93 = vfnmadd231ps_avx512vl(auVar94,auVar88,auVar95);
        auVar29 = vfnmadd213ps_fma(auVar91,auVar83,ZEXT1632(auVar23));
        auVar24 = vfnmadd213ps_fma(auVar82,auVar83,ZEXT1632(auVar24));
        auVar30 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar25),auVar97);
        auVar97 = vsubps_avx512vl(auVar81,ZEXT1632(auVar77));
        auVar95 = vsubps_avx(ZEXT1632(auVar196),ZEXT1632(auVar78));
        auVar92 = vsubps_avx512vl(ZEXT1632(auVar21),auVar93);
        auVar91 = vmulps_avx512vl(auVar95,auVar93);
        auVar22 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar78),auVar92);
        auVar83._4_4_ = auVar77._4_4_ * auVar92._4_4_;
        auVar83._0_4_ = auVar77._0_4_ * auVar92._0_4_;
        auVar83._8_4_ = auVar77._8_4_ * auVar92._8_4_;
        auVar83._12_4_ = auVar77._12_4_ * auVar92._12_4_;
        auVar83._16_4_ = auVar92._16_4_ * 0.0;
        auVar83._20_4_ = auVar92._20_4_ * 0.0;
        auVar83._24_4_ = auVar92._24_4_ * 0.0;
        auVar83._28_4_ = auVar92._28_4_;
        auVar92 = vfmsub231ps_avx512vl(auVar83,auVar93,auVar97);
        auVar84._4_4_ = auVar78._4_4_ * auVar97._4_4_;
        auVar84._0_4_ = auVar78._0_4_ * auVar97._0_4_;
        auVar84._8_4_ = auVar78._8_4_ * auVar97._8_4_;
        auVar84._12_4_ = auVar78._12_4_ * auVar97._12_4_;
        auVar84._16_4_ = auVar97._16_4_ * 0.0;
        auVar84._20_4_ = auVar97._20_4_ * 0.0;
        auVar84._24_4_ = auVar97._24_4_ * 0.0;
        auVar84._28_4_ = auVar97._28_4_;
        auVar23 = vfmsub231ps_fma(auVar84,ZEXT1632(auVar77),auVar95);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar86,auVar92);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar86,ZEXT1632(auVar22));
        auVar96 = ZEXT1632(auVar79);
        uVar62 = vcmpps_avx512vl(auVar95,auVar96,2);
        bVar61 = (byte)uVar62;
        fVar70 = (float)((uint)(bVar61 & 1) * auVar75._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar29._0_4_);
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar117 = (float)((uint)bVar13 * auVar75._4_4_ | (uint)!bVar13 * auVar29._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar119 = (float)((uint)bVar13 * auVar75._8_4_ | (uint)!bVar13 * auVar29._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar122 = (float)((uint)bVar13 * auVar75._12_4_ | (uint)!bVar13 * auVar29._12_4_);
        auVar91 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar119,CONCAT44(fVar117,fVar70))));
        fVar71 = (float)((uint)(bVar61 & 1) * auVar197._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar24._0_4_);
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar118 = (float)((uint)bVar13 * auVar197._4_4_ | (uint)!bVar13 * auVar24._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar120 = (float)((uint)bVar13 * auVar197._8_4_ | (uint)!bVar13 * auVar24._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar123 = (float)((uint)bVar13 * auVar197._12_4_ | (uint)!bVar13 * auVar24._12_4_);
        auVar82 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar120,CONCAT44(fVar118,fVar71))));
        auVar94._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar30._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar94._4_4_ = (float)((uint)bVar13 * auVar80._4_4_ | (uint)!bVar13 * auVar30._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar94._8_4_ = (float)((uint)bVar13 * auVar80._8_4_ | (uint)!bVar13 * auVar30._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar94._12_4_ = (float)((uint)bVar13 * auVar80._12_4_ | (uint)!bVar13 * auVar30._12_4_);
        fVar150 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar80._16_4_);
        auVar94._16_4_ = fVar150;
        fVar135 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar80._20_4_);
        auVar94._20_4_ = fVar135;
        fVar136 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar80._24_4_);
        auVar94._24_4_ = fVar136;
        iVar1 = (uint)(byte)(uVar62 >> 7) * auVar80._28_4_;
        auVar94._28_4_ = iVar1;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar81);
        auVar101._0_4_ =
             (uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar22._0_4_;
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar101._4_4_ = (uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar22._4_4_;
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar101._8_4_ = (uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar22._8_4_;
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar101._12_4_ = (uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar22._12_4_;
        auVar101._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_;
        auVar101._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_;
        auVar101._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_;
        auVar101._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar196));
        auVar102._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar197._0_4_
                    );
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar197._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar197._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar197._12_4_);
        fVar137 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar97._16_4_);
        auVar102._16_4_ = fVar137;
        fVar175 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar97._20_4_);
        auVar102._20_4_ = fVar175;
        fVar172 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar97._24_4_);
        auVar102._24_4_ = fVar172;
        auVar102._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar97._28_4_;
        auVar97 = vblendmps_avx512vl(auVar93,ZEXT1632(auVar21));
        auVar103._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar80._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar80._4_4_);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar80._8_4_);
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar80._12_4_);
        bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar80._16_4_);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar80._20_4_);
        bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar80._24_4_);
        bVar13 = SUB81(uVar62 >> 7,0);
        auVar103._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar80._28_4_;
        auVar104._0_4_ =
             (uint)(bVar61 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar81._0_4_;
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar104._4_4_ = (uint)bVar13 * (int)auVar77._4_4_ | (uint)!bVar13 * auVar81._4_4_;
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar104._8_4_ = (uint)bVar13 * (int)auVar77._8_4_ | (uint)!bVar13 * auVar81._8_4_;
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar104._12_4_ = (uint)bVar13 * (int)auVar77._12_4_ | (uint)!bVar13 * auVar81._12_4_;
        auVar104._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar81._16_4_;
        auVar104._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar81._20_4_;
        auVar104._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar81._24_4_;
        auVar104._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar81._28_4_;
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar105._0_4_ =
             (uint)(bVar61 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar21._0_4_;
        bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar21._4_4_;
        bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar21._8_4_;
        bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar21._12_4_;
        auVar105._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar93._16_4_;
        auVar105._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar93._20_4_;
        auVar105._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar93._24_4_;
        iVar2 = (uint)(byte)(uVar62 >> 7) * auVar93._28_4_;
        auVar105._28_4_ = iVar2;
        auVar83 = vsubps_avx512vl(auVar104,auVar91);
        auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar78._12_4_ |
                                                (uint)!bVar16 * auVar196._12_4_,
                                                CONCAT48((uint)bVar15 * (int)auVar78._8_4_ |
                                                         (uint)!bVar15 * auVar196._8_4_,
                                                         CONCAT44((uint)bVar13 * (int)auVar78._4_4_
                                                                  | (uint)!bVar13 * auVar196._4_4_,
                                                                  (uint)(bVar61 & 1) *
                                                                  (int)auVar78._0_4_ |
                                                                  (uint)!(bool)(bVar61 & 1) *
                                                                  auVar196._0_4_)))),auVar82);
        auVar93 = vsubps_avx(auVar105,auVar94);
        auVar92 = vsubps_avx(auVar91,auVar101);
        auVar80 = vsubps_avx(auVar82,auVar102);
        auVar81 = vsubps_avx(auVar94,auVar103);
        auVar86._4_4_ = auVar93._4_4_ * fVar117;
        auVar86._0_4_ = auVar93._0_4_ * fVar70;
        auVar86._8_4_ = auVar93._8_4_ * fVar119;
        auVar86._12_4_ = auVar93._12_4_ * fVar122;
        auVar86._16_4_ = auVar93._16_4_ * 0.0;
        auVar86._20_4_ = auVar93._20_4_ * 0.0;
        auVar86._24_4_ = auVar93._24_4_ * 0.0;
        auVar86._28_4_ = iVar2;
        auVar75 = vfmsub231ps_fma(auVar86,auVar94,auVar83);
        auVar87._4_4_ = fVar118 * auVar83._4_4_;
        auVar87._0_4_ = fVar71 * auVar83._0_4_;
        auVar87._8_4_ = fVar120 * auVar83._8_4_;
        auVar87._12_4_ = fVar123 * auVar83._12_4_;
        auVar87._16_4_ = auVar83._16_4_ * 0.0;
        auVar87._20_4_ = auVar83._20_4_ * 0.0;
        auVar87._24_4_ = auVar83._24_4_ * 0.0;
        auVar87._28_4_ = auVar95._28_4_;
        auVar197 = vfmsub231ps_fma(auVar87,auVar91,auVar97);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar197),auVar96,ZEXT1632(auVar75));
        auVar159._0_4_ = auVar97._0_4_ * auVar94._0_4_;
        auVar159._4_4_ = auVar97._4_4_ * auVar94._4_4_;
        auVar159._8_4_ = auVar97._8_4_ * auVar94._8_4_;
        auVar159._12_4_ = auVar97._12_4_ * auVar94._12_4_;
        auVar159._16_4_ = auVar97._16_4_ * fVar150;
        auVar159._20_4_ = auVar97._20_4_ * fVar135;
        auVar159._24_4_ = auVar97._24_4_ * fVar136;
        auVar159._28_4_ = 0;
        auVar75 = vfmsub231ps_fma(auVar159,auVar82,auVar93);
        auVar84 = vfmadd231ps_avx512vl(auVar95,auVar96,ZEXT1632(auVar75));
        auVar95 = vmulps_avx512vl(auVar81,auVar101);
        auVar95 = vfmsub231ps_avx512vl(auVar95,auVar92,auVar103);
        auVar90._4_4_ = auVar80._4_4_ * auVar103._4_4_;
        auVar90._0_4_ = auVar80._0_4_ * auVar103._0_4_;
        auVar90._8_4_ = auVar80._8_4_ * auVar103._8_4_;
        auVar90._12_4_ = auVar80._12_4_ * auVar103._12_4_;
        auVar90._16_4_ = auVar80._16_4_ * auVar103._16_4_;
        auVar90._20_4_ = auVar80._20_4_ * auVar103._20_4_;
        auVar90._24_4_ = auVar80._24_4_ * auVar103._24_4_;
        auVar90._28_4_ = auVar103._28_4_;
        auVar75 = vfmsub231ps_fma(auVar90,auVar102,auVar81);
        auVar160._0_4_ = auVar102._0_4_ * auVar92._0_4_;
        auVar160._4_4_ = auVar102._4_4_ * auVar92._4_4_;
        auVar160._8_4_ = auVar102._8_4_ * auVar92._8_4_;
        auVar160._12_4_ = auVar102._12_4_ * auVar92._12_4_;
        auVar160._16_4_ = fVar137 * auVar92._16_4_;
        auVar160._20_4_ = fVar175 * auVar92._20_4_;
        auVar160._24_4_ = fVar172 * auVar92._24_4_;
        auVar160._28_4_ = 0;
        auVar197 = vfmsub231ps_fma(auVar160,auVar80,auVar101);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar197),auVar96,auVar95);
        auVar86 = vfmadd231ps_avx512vl(auVar95,auVar96,ZEXT1632(auVar75));
        auVar95 = vmaxps_avx(auVar84,auVar86);
        uVar138 = vcmpps_avx512vl(auVar95,auVar96,2);
        bVar69 = bVar69 & (byte)uVar138;
        auVar199 = ZEXT3264(local_580);
        auVar200 = ZEXT3264(local_4e0);
        auVar201 = ZEXT3264(local_5a0);
        auVar202 = ZEXT3264(local_500);
        auVar203 = ZEXT3264(local_5c0);
        auVar204 = ZEXT3264(local_5e0);
        auVar205 = ZEXT3264(local_520);
        if (bVar69 == 0) {
          uVar64 = 0;
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar195 = ZEXT3264(auVar95);
        }
        else {
          auVar87 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
          auVar194 = ZEXT3264(auVar87);
          auVar36._4_4_ = auVar81._4_4_ * auVar97._4_4_;
          auVar36._0_4_ = auVar81._0_4_ * auVar97._0_4_;
          auVar36._8_4_ = auVar81._8_4_ * auVar97._8_4_;
          auVar36._12_4_ = auVar81._12_4_ * auVar97._12_4_;
          auVar36._16_4_ = auVar81._16_4_ * auVar97._16_4_;
          auVar36._20_4_ = auVar81._20_4_ * auVar97._20_4_;
          auVar36._24_4_ = auVar81._24_4_ * auVar97._24_4_;
          auVar36._28_4_ = auVar95._28_4_;
          auVar196 = vfmsub231ps_fma(auVar36,auVar80,auVar93);
          auVar37._4_4_ = auVar93._4_4_ * auVar92._4_4_;
          auVar37._0_4_ = auVar93._0_4_ * auVar92._0_4_;
          auVar37._8_4_ = auVar93._8_4_ * auVar92._8_4_;
          auVar37._12_4_ = auVar93._12_4_ * auVar92._12_4_;
          auVar37._16_4_ = auVar93._16_4_ * auVar92._16_4_;
          auVar37._20_4_ = auVar93._20_4_ * auVar92._20_4_;
          auVar37._24_4_ = auVar93._24_4_ * auVar92._24_4_;
          auVar37._28_4_ = auVar93._28_4_;
          auVar197 = vfmsub231ps_fma(auVar37,auVar83,auVar81);
          auVar38._4_4_ = auVar80._4_4_ * auVar83._4_4_;
          auVar38._0_4_ = auVar80._0_4_ * auVar83._0_4_;
          auVar38._8_4_ = auVar80._8_4_ * auVar83._8_4_;
          auVar38._12_4_ = auVar80._12_4_ * auVar83._12_4_;
          auVar38._16_4_ = auVar80._16_4_ * auVar83._16_4_;
          auVar38._20_4_ = auVar80._20_4_ * auVar83._20_4_;
          auVar38._24_4_ = auVar80._24_4_ * auVar83._24_4_;
          auVar38._28_4_ = auVar80._28_4_;
          auVar21 = vfmsub231ps_fma(auVar38,auVar92,auVar97);
          auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar197),ZEXT1632(auVar21));
          auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar196),auVar96);
          auVar97 = vrcp14ps_avx512vl(auVar95);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar195 = ZEXT3264(auVar93);
          auVar92 = vfnmadd213ps_avx512vl(auVar97,auVar95,auVar93);
          auVar75 = vfmadd132ps_fma(auVar92,auVar97,auVar97);
          auVar39._4_4_ = auVar21._4_4_ * auVar94._4_4_;
          auVar39._0_4_ = auVar21._0_4_ * auVar94._0_4_;
          auVar39._8_4_ = auVar21._8_4_ * auVar94._8_4_;
          auVar39._12_4_ = auVar21._12_4_ * auVar94._12_4_;
          auVar39._16_4_ = fVar150 * 0.0;
          auVar39._20_4_ = fVar135 * 0.0;
          auVar39._24_4_ = fVar136 * 0.0;
          auVar39._28_4_ = iVar1;
          auVar197 = vfmadd231ps_fma(auVar39,auVar82,ZEXT1632(auVar197));
          auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar91,ZEXT1632(auVar196));
          fVar150 = auVar75._0_4_;
          fVar135 = auVar75._4_4_;
          fVar136 = auVar75._8_4_;
          fVar137 = auVar75._12_4_;
          local_380 = ZEXT1632(CONCAT412(auVar197._12_4_ * fVar137,
                                         CONCAT48(auVar197._8_4_ * fVar136,
                                                  CONCAT44(auVar197._4_4_ * fVar135,
                                                           auVar197._0_4_ * fVar150))));
          auVar178._4_4_ = uVar66;
          auVar178._0_4_ = uVar66;
          auVar178._8_4_ = uVar66;
          auVar178._12_4_ = uVar66;
          auVar178._16_4_ = uVar66;
          auVar178._20_4_ = uVar66;
          auVar178._24_4_ = uVar66;
          auVar178._28_4_ = uVar66;
          uVar138 = vcmpps_avx512vl(local_380,auVar87,2);
          uVar26 = vcmpps_avx512vl(auVar178,local_380,2);
          bVar69 = (byte)uVar138 & (byte)uVar26 & bVar69;
          auVar193 = ZEXT3264(auVar85);
          if (bVar69 != 0) {
            uVar138 = vcmpps_avx512vl(auVar95,auVar96,4);
            bVar69 = bVar69 & (byte)uVar138;
            if (bVar69 != 0) {
              fVar172 = auVar84._0_4_ * fVar150;
              fVar175 = auVar84._4_4_ * fVar135;
              auVar40._4_4_ = fVar175;
              auVar40._0_4_ = fVar172;
              fVar70 = auVar84._8_4_ * fVar136;
              auVar40._8_4_ = fVar70;
              fVar71 = auVar84._12_4_ * fVar137;
              auVar40._12_4_ = fVar71;
              fVar117 = auVar84._16_4_ * 0.0;
              auVar40._16_4_ = fVar117;
              fVar118 = auVar84._20_4_ * 0.0;
              auVar40._20_4_ = fVar118;
              fVar119 = auVar84._24_4_ * 0.0;
              auVar40._24_4_ = fVar119;
              auVar40._28_4_ = auVar95._28_4_;
              auVar97 = vsubps_avx512vl(auVar93,auVar40);
              local_3c0._0_4_ =
                   (float)((uint)(bVar61 & 1) * (int)fVar172 |
                          (uint)!(bool)(bVar61 & 1) * auVar97._0_4_);
              bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
              local_3c0._4_4_ = (float)((uint)bVar13 * (int)fVar175 | (uint)!bVar13 * auVar97._4_4_)
              ;
              bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
              local_3c0._8_4_ = (float)((uint)bVar13 * (int)fVar70 | (uint)!bVar13 * auVar97._8_4_);
              bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
              local_3c0._12_4_ =
                   (float)((uint)bVar13 * (int)fVar71 | (uint)!bVar13 * auVar97._12_4_);
              bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
              local_3c0._16_4_ =
                   (float)((uint)bVar13 * (int)fVar117 | (uint)!bVar13 * auVar97._16_4_);
              bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
              local_3c0._20_4_ =
                   (float)((uint)bVar13 * (int)fVar118 | (uint)!bVar13 * auVar97._20_4_);
              bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
              local_3c0._24_4_ =
                   (float)((uint)bVar13 * (int)fVar119 | (uint)!bVar13 * auVar97._24_4_);
              bVar13 = SUB81(uVar62 >> 7,0);
              local_3c0._28_4_ =
                   (float)((uint)bVar13 * auVar95._28_4_ | (uint)!bVar13 * auVar97._28_4_);
              auVar95 = vsubps_avx(ZEXT1632(auVar25),auVar88);
              auVar75 = vfmadd213ps_fma(auVar95,local_3c0,auVar88);
              uVar126 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar88._4_4_ = uVar126;
              auVar88._0_4_ = uVar126;
              auVar88._8_4_ = uVar126;
              auVar88._12_4_ = uVar126;
              auVar88._16_4_ = uVar126;
              auVar88._20_4_ = uVar126;
              auVar88._24_4_ = uVar126;
              auVar88._28_4_ = uVar126;
              auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                                           CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                                                    CONCAT44(auVar75._4_4_ +
                                                                             auVar75._4_4_,
                                                                             auVar75._0_4_ +
                                                                             auVar75._0_4_)))),
                                        auVar88);
              uVar138 = vcmpps_avx512vl(local_380,auVar95,6);
              if (((byte)uVar138 & bVar69) != 0) {
                auVar155._0_4_ = auVar86._0_4_ * fVar150;
                auVar155._4_4_ = auVar86._4_4_ * fVar135;
                auVar155._8_4_ = auVar86._8_4_ * fVar136;
                auVar155._12_4_ = auVar86._12_4_ * fVar137;
                auVar155._16_4_ = auVar86._16_4_ * 0.0;
                auVar155._20_4_ = auVar86._20_4_ * 0.0;
                auVar155._24_4_ = auVar86._24_4_ * 0.0;
                auVar155._28_4_ = 0;
                auVar95 = vsubps_avx512vl(auVar93,auVar155);
                auVar106._0_4_ =
                     (uint)(bVar61 & 1) * (int)auVar155._0_4_ |
                     (uint)!(bool)(bVar61 & 1) * auVar95._0_4_;
                bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
                auVar106._4_4_ = (uint)bVar13 * (int)auVar155._4_4_ | (uint)!bVar13 * auVar95._4_4_;
                bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
                auVar106._8_4_ = (uint)bVar13 * (int)auVar155._8_4_ | (uint)!bVar13 * auVar95._8_4_;
                bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
                auVar106._12_4_ =
                     (uint)bVar13 * (int)auVar155._12_4_ | (uint)!bVar13 * auVar95._12_4_;
                bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                auVar106._16_4_ =
                     (uint)bVar13 * (int)auVar155._16_4_ | (uint)!bVar13 * auVar95._16_4_;
                bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
                auVar106._20_4_ =
                     (uint)bVar13 * (int)auVar155._20_4_ | (uint)!bVar13 * auVar95._20_4_;
                bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
                auVar106._24_4_ =
                     (uint)bVar13 * (int)auVar155._24_4_ | (uint)!bVar13 * auVar95._24_4_;
                auVar106._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar95._28_4_;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3a0 = vfmsub132ps_avx512vl(auVar106,auVar93,auVar33);
                local_360 = 0;
                local_350 = local_670._0_8_;
                uStack_348 = local_670._8_8_;
                local_340 = local_680._0_8_;
                uStack_338 = local_680._8_8_;
                local_330 = local_690._0_8_;
                uStack_328 = local_690._8_8_;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar64 = CONCAT71((int7)(uVar64 >> 8),1),
                     pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar150 = 1.0 / auVar89._0_4_;
                    local_300[0] = fVar150 * (local_3c0._0_4_ + 0.0);
                    local_300[1] = fVar150 * (local_3c0._4_4_ + 1.0);
                    local_300[2] = fVar150 * (local_3c0._8_4_ + 2.0);
                    local_300[3] = fVar150 * (local_3c0._12_4_ + 3.0);
                    fStack_2f0 = fVar150 * (local_3c0._16_4_ + 4.0);
                    fStack_2ec = fVar150 * (local_3c0._20_4_ + 5.0);
                    fStack_2e8 = fVar150 * (local_3c0._24_4_ + 6.0);
                    fStack_2e4 = local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    lVar67 = 0;
                    uVar65 = (ulong)((byte)uVar138 & bVar69);
                    for (uVar62 = uVar65; (uVar62 & 1) == 0;
                        uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                      lVar67 = lVar67 + 1;
                    }
                    _local_420 = vpbroadcastd_avx512vl();
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_600 = auVar85;
                    local_560 = auVar87;
                    local_35c = iVar8;
                    do {
                      auVar196 = auVar198._0_16_;
                      local_200 = local_300[lVar67];
                      local_400 = (uint)lVar67;
                      uStack_3fc = (undefined4)((ulong)lVar67 >> 0x20);
                      local_1e0 = *(undefined4 *)(local_2e0 + lVar67 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + lVar67 * 4)
                      ;
                      local_6c0.context = context->user;
                      fVar135 = 1.0 - local_200;
                      fVar150 = fVar135 * fVar135 * -3.0;
                      auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                                ZEXT416((uint)(local_200 * fVar135)),
                                                ZEXT416(0xc0000000));
                      auVar197 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar135)),
                                                 ZEXT416((uint)(local_200 * local_200)),
                                                 ZEXT416(0x40000000));
                      fVar135 = auVar75._0_4_ * 3.0;
                      fVar136 = auVar197._0_4_ * 3.0;
                      fVar137 = local_200 * local_200 * 3.0;
                      auVar168._0_4_ = fVar137 * (float)local_490._0_4_;
                      auVar168._4_4_ = fVar137 * (float)local_490._4_4_;
                      auVar168._8_4_ = fVar137 * fStack_488;
                      auVar168._12_4_ = fVar137 * fStack_484;
                      auVar131._4_4_ = fVar136;
                      auVar131._0_4_ = fVar136;
                      auVar131._8_4_ = fVar136;
                      auVar131._12_4_ = fVar136;
                      auVar75 = vfmadd132ps_fma(auVar131,auVar168,local_690);
                      auVar153._4_4_ = fVar135;
                      auVar153._0_4_ = fVar135;
                      auVar153._8_4_ = fVar135;
                      auVar153._12_4_ = fVar135;
                      auVar75 = vfmadd132ps_fma(auVar153,auVar75,local_680);
                      auVar132._4_4_ = fVar150;
                      auVar132._0_4_ = fVar150;
                      auVar132._8_4_ = fVar150;
                      auVar132._12_4_ = fVar150;
                      auVar75 = vfmadd132ps_fma(auVar132,auVar75,local_670);
                      local_260 = auVar75._0_4_;
                      auVar161._8_4_ = 1;
                      auVar161._0_8_ = 0x100000001;
                      auVar161._12_4_ = 1;
                      auVar161._16_4_ = 1;
                      auVar161._20_4_ = 1;
                      auVar161._24_4_ = 1;
                      auVar161._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar161,ZEXT1632(auVar75));
                      auVar170._8_4_ = 2;
                      auVar170._0_8_ = 0x200000002;
                      auVar170._12_4_ = 2;
                      auVar170._16_4_ = 2;
                      auVar170._20_4_ = 2;
                      auVar170._24_4_ = 2;
                      auVar170._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar170,ZEXT1632(auVar75));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_4c0._0_8_;
                      uStack_1b8 = local_4c0._8_8_;
                      uStack_1b0 = local_4c0._16_8_;
                      uStack_1a8 = local_4c0._24_8_;
                      local_1a0 = _local_420;
                      vpcmpeqd_avx2(_local_420,_local_420);
                      local_180 = (local_6c0.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_6c0.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_660 = local_280;
                      local_6c0.valid = (int *)local_660;
                      local_6c0.geometryUserPtr = pGVar9->userPtr;
                      local_6c0.hit = (RTCHitN *)&local_260;
                      local_6c0.N = 8;
                      local_480 = (uint)uVar65;
                      uStack_47c = (uint)(uVar65 >> 0x20);
                      local_6c0.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_6c0);
                        uVar65 = CONCAT44(uStack_47c,local_480);
                        auVar194 = ZEXT3264(local_560);
                        auVar193 = ZEXT3264(local_600);
                        auVar206 = ZEXT3264(local_540);
                        auVar205 = ZEXT3264(local_520);
                        auVar204 = ZEXT3264(local_5e0);
                        auVar203 = ZEXT3264(local_5c0);
                        auVar202 = ZEXT3264(local_500);
                        auVar201 = ZEXT3264(local_5a0);
                        auVar200 = ZEXT3264(local_4e0);
                        auVar199 = ZEXT3264(local_580);
                        auVar75 = vxorps_avx512vl(auVar196,auVar196);
                        auVar198 = ZEXT1664(auVar75);
                        uVar66 = local_620._0_4_;
                      }
                      auVar75 = auVar198._0_16_;
                      local_6f0 = auVar76;
                      if (local_660 == (undefined1  [32])0x0) {
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar195 = ZEXT3264(auVar95);
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if (p_Var12 == (RTCFilterFunctionN)0x0) {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar95);
                        }
                        else {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar95);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var12)(&local_6c0);
                            uVar65 = CONCAT44(uStack_47c,local_480);
                            auVar194 = ZEXT3264(local_560);
                            auVar193 = ZEXT3264(local_600);
                            auVar206 = ZEXT3264(local_540);
                            auVar205 = ZEXT3264(local_520);
                            auVar204 = ZEXT3264(local_5e0);
                            auVar203 = ZEXT3264(local_5c0);
                            auVar202 = ZEXT3264(local_500);
                            auVar201 = ZEXT3264(local_5a0);
                            auVar200 = ZEXT3264(local_4e0);
                            auVar199 = ZEXT3264(local_580);
                            auVar75 = vxorps_avx512vl(auVar75,auVar75);
                            auVar198 = ZEXT1664(auVar75);
                            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar195 = ZEXT3264(auVar95);
                            uVar66 = local_620._0_4_;
                          }
                        }
                        auVar85 = auVar193._0_32_;
                        uVar62 = vptestmd_avx512vl(local_660,local_660);
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar13 = (bool)((byte)uVar62 & 1);
                        bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar62 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar62 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar62 >> 6) & 1);
                        bVar20 = SUB81(uVar62 >> 7,0);
                        *(uint *)(local_6c0.ray + 0x100) =
                             (uint)bVar13 * auVar95._0_4_ |
                             (uint)!bVar13 * *(int *)(local_6c0.ray + 0x100);
                        *(uint *)(local_6c0.ray + 0x104) =
                             (uint)bVar14 * auVar95._4_4_ |
                             (uint)!bVar14 * *(int *)(local_6c0.ray + 0x104);
                        *(uint *)(local_6c0.ray + 0x108) =
                             (uint)bVar15 * auVar95._8_4_ |
                             (uint)!bVar15 * *(int *)(local_6c0.ray + 0x108);
                        *(uint *)(local_6c0.ray + 0x10c) =
                             (uint)bVar16 * auVar95._12_4_ |
                             (uint)!bVar16 * *(int *)(local_6c0.ray + 0x10c);
                        *(uint *)(local_6c0.ray + 0x110) =
                             (uint)bVar17 * auVar95._16_4_ |
                             (uint)!bVar17 * *(int *)(local_6c0.ray + 0x110);
                        *(uint *)(local_6c0.ray + 0x114) =
                             (uint)bVar18 * auVar95._20_4_ |
                             (uint)!bVar18 * *(int *)(local_6c0.ray + 0x114);
                        *(uint *)(local_6c0.ray + 0x118) =
                             (uint)bVar19 * auVar95._24_4_ |
                             (uint)!bVar19 * *(int *)(local_6c0.ray + 0x118);
                        *(uint *)(local_6c0.ray + 0x11c) =
                             (uint)bVar20 * auVar95._28_4_ |
                             (uint)!bVar20 * *(int *)(local_6c0.ray + 0x11c);
                        if (local_660 != (undefined1  [32])0x0) {
                          uVar64 = CONCAT71((int7)(uVar64 >> 8),1);
                          break;
                        }
                      }
                      auVar85 = auVar193._0_32_;
                      *(int *)(ray + k * 4 + 0x100) = auVar194._0_4_;
                      uVar64 = 0;
                      lVar67 = 0;
                      uVar65 = uVar65 ^ 1L << ((ulong)local_400 & 0x3f);
                      for (uVar62 = uVar65; (uVar62 & 1) == 0;
                          uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                        lVar67 = lVar67 + 1;
                      }
                    } while (uVar65 != 0);
                  }
                  goto LAB_01bf2fd2;
                }
              }
            }
          }
          uVar64 = 0;
        }
      }
LAB_01bf2fd2:
      local_400 = auVar76._0_4_;
      if (8 < iVar8) {
        local_620 = vpbroadcastd_avx512vl();
        local_420._4_4_ = 1.0 / (float)local_460._0_4_;
        local_420._0_4_ = local_420._4_4_;
        fStack_418 = (float)local_420._4_4_;
        fStack_414 = (float)local_420._4_4_;
        fStack_410 = (float)local_420._4_4_;
        fStack_40c = (float)local_420._4_4_;
        fStack_408 = (float)local_420._4_4_;
        fStack_404 = (float)local_420._4_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar67 = 8;
        local_600 = auVar85;
        local_480 = uVar66;
        uStack_47c = uVar66;
        uStack_478 = uVar66;
        uStack_474 = uVar66;
        uStack_470 = uVar66;
        uStack_46c = uVar66;
        uStack_468 = uVar66;
        uStack_464 = uVar66;
        uStack_3fc = local_400;
        uStack_3f8 = local_400;
        uStack_3f4 = local_400;
        uStack_3f0 = local_400;
        uStack_3ec = local_400;
        uStack_3e8 = local_400;
        uStack_3e4 = local_400;
        do {
          auVar95 = vpbroadcastd_avx512vl();
          auVar80 = vpor_avx2(auVar95,_DAT_01fe9900);
          uVar26 = vpcmpd_avx512vl(auVar80,local_620,1);
          auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 * 4 + lVar27);
          auVar97 = *(undefined1 (*) [32])(lVar27 + 0x21aa768 + lVar67 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar27 + 0x21aabec + lVar67 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar27 + 0x21ab070 + lVar67 * 4);
          local_520 = auVar205._0_32_;
          auVar81 = vmulps_avx512vl(local_520,auVar92);
          local_540 = auVar206._0_32_;
          auVar91 = vmulps_avx512vl(local_540,auVar92);
          auVar41._4_4_ = auVar92._4_4_ * (float)local_e0._4_4_;
          auVar41._0_4_ = auVar92._0_4_ * (float)local_e0._0_4_;
          auVar41._8_4_ = auVar92._8_4_ * fStack_d8;
          auVar41._12_4_ = auVar92._12_4_ * fStack_d4;
          auVar41._16_4_ = auVar92._16_4_ * fStack_d0;
          auVar41._20_4_ = auVar92._20_4_ * fStack_cc;
          auVar41._24_4_ = auVar92._24_4_ * fStack_c8;
          auVar41._28_4_ = auVar80._28_4_;
          auVar99 = auVar203._0_32_;
          auVar80 = vfmadd231ps_avx512vl(auVar81,auVar93,auVar99);
          auVar100 = auVar204._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar100);
          auVar91 = vfmadd231ps_avx512vl(auVar41,auVar93,local_c0);
          auVar98 = auVar201._0_32_;
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,auVar98);
          local_500 = auVar202._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar97,local_500);
          auVar76 = vfmadd231ps_fma(auVar91,auVar97,local_a0);
          auVar96 = auVar199._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar80,auVar95,auVar96);
          local_4e0 = auVar200._0_32_;
          auVar86 = vfmadd231ps_avx512vl(auVar81,auVar95,local_4e0);
          auVar80 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 * 4 + lVar27);
          auVar81 = *(undefined1 (*) [32])(lVar27 + 0x21acb88 + lVar67 * 4);
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar95,local_80);
          auVar91 = *(undefined1 (*) [32])(lVar27 + 0x21ad00c + lVar67 * 4);
          auVar82 = *(undefined1 (*) [32])(lVar27 + 0x21ad490 + lVar67 * 4);
          auVar85 = vmulps_avx512vl(local_520,auVar82);
          auVar83 = vmulps_avx512vl(local_540,auVar82);
          auVar42._4_4_ = auVar82._4_4_ * (float)local_e0._4_4_;
          auVar42._0_4_ = auVar82._0_4_ * (float)local_e0._0_4_;
          auVar42._8_4_ = auVar82._8_4_ * fStack_d8;
          auVar42._12_4_ = auVar82._12_4_ * fStack_d4;
          auVar42._16_4_ = auVar82._16_4_ * fStack_d0;
          auVar42._20_4_ = auVar82._20_4_ * fStack_cc;
          auVar42._24_4_ = auVar82._24_4_ * fStack_c8;
          auVar42._28_4_ = uStack_c4;
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar91,auVar99);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar91,auVar100);
          auVar87 = vfmadd231ps_avx512vl(auVar42,auVar91,local_c0);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,auVar98);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar81,local_500);
          auVar75 = vfmadd231ps_fma(auVar87,auVar81,local_a0);
          auVar87 = vfmadd231ps_avx512vl(auVar85,auVar80,auVar96);
          auVar88 = vfmadd231ps_avx512vl(auVar83,auVar80,local_4e0);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar80,local_80);
          auVar89 = vmaxps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar75));
          auVar85 = vsubps_avx(auVar87,auVar84);
          auVar83 = vsubps_avx(auVar88,auVar86);
          auVar90 = vmulps_avx512vl(auVar86,auVar85);
          auVar94 = vmulps_avx512vl(auVar84,auVar83);
          auVar90 = vsubps_avx512vl(auVar90,auVar94);
          auVar94 = vmulps_avx512vl(auVar83,auVar83);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar85,auVar85);
          auVar89 = vmulps_avx512vl(auVar89,auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar94);
          auVar90 = vmulps_avx512vl(auVar90,auVar90);
          uVar138 = vcmpps_avx512vl(auVar90,auVar89,2);
          bVar69 = (byte)uVar26 & (byte)uVar138;
          if (bVar69 != 0) {
            auVar82 = vmulps_avx512vl(local_600,auVar82);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar82);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_120,auVar91);
            auVar80 = vfmadd213ps_avx512vl(auVar80,local_100,auVar81);
            auVar92 = vmulps_avx512vl(local_600,auVar92);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_140,auVar92);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar93);
            auVar81 = vfmadd213ps_avx512vl(auVar95,local_100,auVar97);
            auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21ab4f4 + lVar67 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar27 + 0x21ab978 + lVar67 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar27 + 0x21abdfc + lVar67 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar27 + 0x21ac280 + lVar67 * 4);
            auVar91 = vmulps_avx512vl(local_520,auVar92);
            auVar82 = vmulps_avx512vl(local_540,auVar92);
            auVar92 = vmulps_avx512vl(local_600,auVar92);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar99);
            auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,auVar100);
            auVar93 = vfmadd231ps_avx512vl(auVar92,local_140,auVar93);
            auVar92 = vfmadd231ps_avx512vl(auVar91,auVar97,auVar98);
            auVar91 = vfmadd231ps_avx512vl(auVar82,auVar97,local_500);
            auVar97 = vfmadd231ps_avx512vl(auVar93,local_120,auVar97);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar96);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar95,local_4e0);
            auVar82 = vfmadd231ps_avx512vl(auVar97,local_100,auVar95);
            auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21ad914 + lVar67 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar27 + 0x21ae21c + lVar67 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar27 + 0x21ae6a0 + lVar67 * 4);
            auVar89 = vmulps_avx512vl(local_520,auVar93);
            auVar90 = vmulps_avx512vl(local_540,auVar93);
            auVar93 = vmulps_avx512vl(local_600,auVar93);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar99);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar100);
            auVar93 = vfmadd231ps_avx512vl(auVar93,local_140,auVar97);
            auVar97 = *(undefined1 (*) [32])(lVar27 + 0x21add98 + lVar67 * 4);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar97,auVar98);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,local_500);
            auVar97 = vfmadd231ps_avx512vl(auVar93,local_120,auVar97);
            auVar93 = vfmadd231ps_avx512vl(auVar89,auVar95,auVar96);
            auVar89 = vfmadd231ps_avx512vl(auVar90,auVar95,local_4e0);
            auVar97 = vfmadd231ps_avx512vl(auVar97,local_100,auVar95);
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar92,auVar90);
            vandps_avx512vl(auVar91,auVar90);
            auVar95 = vmaxps_avx(auVar90,auVar90);
            vandps_avx512vl(auVar82,auVar90);
            auVar95 = vmaxps_avx(auVar95,auVar90);
            auVar60._4_4_ = uStack_3fc;
            auVar60._0_4_ = local_400;
            auVar60._8_4_ = uStack_3f8;
            auVar60._12_4_ = uStack_3f4;
            auVar60._16_4_ = uStack_3f0;
            auVar60._20_4_ = uStack_3ec;
            auVar60._24_4_ = uStack_3e8;
            auVar60._28_4_ = uStack_3e4;
            uVar62 = vcmpps_avx512vl(auVar95,auVar60,1);
            bVar13 = (bool)((byte)uVar62 & 1);
            auVar107._0_4_ = (float)((uint)bVar13 * auVar85._0_4_ | (uint)!bVar13 * auVar92._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * auVar92._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * auVar92._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * auVar92._12_4_);
            bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar107._16_4_ =
                 (float)((uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * auVar92._16_4_);
            bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar107._20_4_ =
                 (float)((uint)bVar13 * auVar85._20_4_ | (uint)!bVar13 * auVar92._20_4_);
            bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar107._24_4_ =
                 (float)((uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * auVar92._24_4_);
            bVar13 = SUB81(uVar62 >> 7,0);
            auVar107._28_4_ = (uint)bVar13 * auVar85._28_4_ | (uint)!bVar13 * auVar92._28_4_;
            bVar13 = (bool)((byte)uVar62 & 1);
            auVar108._0_4_ = (float)((uint)bVar13 * auVar83._0_4_ | (uint)!bVar13 * auVar91._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar108._4_4_ = (float)((uint)bVar13 * auVar83._4_4_ | (uint)!bVar13 * auVar91._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar108._8_4_ = (float)((uint)bVar13 * auVar83._8_4_ | (uint)!bVar13 * auVar91._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar108._12_4_ =
                 (float)((uint)bVar13 * auVar83._12_4_ | (uint)!bVar13 * auVar91._12_4_);
            bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar108._16_4_ =
                 (float)((uint)bVar13 * auVar83._16_4_ | (uint)!bVar13 * auVar91._16_4_);
            bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar108._20_4_ =
                 (float)((uint)bVar13 * auVar83._20_4_ | (uint)!bVar13 * auVar91._20_4_);
            bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar108._24_4_ =
                 (float)((uint)bVar13 * auVar83._24_4_ | (uint)!bVar13 * auVar91._24_4_);
            bVar13 = SUB81(uVar62 >> 7,0);
            auVar108._28_4_ = (uint)bVar13 * auVar83._28_4_ | (uint)!bVar13 * auVar91._28_4_;
            vandps_avx512vl(auVar93,auVar90);
            vandps_avx512vl(auVar89,auVar90);
            auVar95 = vmaxps_avx(auVar108,auVar108);
            vandps_avx512vl(auVar97,auVar90);
            auVar95 = vmaxps_avx(auVar95,auVar108);
            uVar62 = vcmpps_avx512vl(auVar95,auVar60,1);
            bVar13 = (bool)((byte)uVar62 & 1);
            auVar109._0_4_ = (uint)bVar13 * auVar85._0_4_ | (uint)!bVar13 * auVar93._0_4_;
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar109._4_4_ = (uint)bVar13 * auVar85._4_4_ | (uint)!bVar13 * auVar93._4_4_;
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar109._8_4_ = (uint)bVar13 * auVar85._8_4_ | (uint)!bVar13 * auVar93._8_4_;
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar109._12_4_ = (uint)bVar13 * auVar85._12_4_ | (uint)!bVar13 * auVar93._12_4_;
            bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar109._16_4_ = (uint)bVar13 * auVar85._16_4_ | (uint)!bVar13 * auVar93._16_4_;
            bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar109._20_4_ = (uint)bVar13 * auVar85._20_4_ | (uint)!bVar13 * auVar93._20_4_;
            bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar109._24_4_ = (uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * auVar93._24_4_;
            bVar13 = SUB81(uVar62 >> 7,0);
            auVar109._28_4_ = (uint)bVar13 * auVar85._28_4_ | (uint)!bVar13 * auVar93._28_4_;
            bVar13 = (bool)((byte)uVar62 & 1);
            auVar110._0_4_ = (float)((uint)bVar13 * auVar83._0_4_ | (uint)!bVar13 * auVar89._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar13 * auVar83._4_4_ | (uint)!bVar13 * auVar89._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar13 * auVar83._8_4_ | (uint)!bVar13 * auVar89._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar13 * auVar83._12_4_ | (uint)!bVar13 * auVar89._12_4_);
            bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar13 * auVar83._16_4_ | (uint)!bVar13 * auVar89._16_4_);
            bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar13 * auVar83._20_4_ | (uint)!bVar13 * auVar89._20_4_);
            bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar13 * auVar83._24_4_ | (uint)!bVar13 * auVar89._24_4_);
            bVar13 = SUB81(uVar62 >> 7,0);
            auVar110._28_4_ = (uint)bVar13 * auVar83._28_4_ | (uint)!bVar13 * auVar89._28_4_;
            auVar182._8_4_ = 0x80000000;
            auVar182._0_8_ = 0x8000000080000000;
            auVar182._12_4_ = 0x80000000;
            auVar182._16_4_ = 0x80000000;
            auVar182._20_4_ = 0x80000000;
            auVar182._24_4_ = 0x80000000;
            auVar182._28_4_ = 0x80000000;
            auVar95 = vxorps_avx512vl(auVar109,auVar182);
            auVar89 = auVar198._0_32_;
            auVar97 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar89);
            auVar197 = vfmadd231ps_fma(auVar97,auVar108,auVar108);
            auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar197));
            auVar192._8_4_ = 0xbf000000;
            auVar192._0_8_ = 0xbf000000bf000000;
            auVar192._12_4_ = 0xbf000000;
            auVar192._16_4_ = 0xbf000000;
            auVar192._20_4_ = 0xbf000000;
            auVar192._24_4_ = 0xbf000000;
            auVar192._28_4_ = 0xbf000000;
            fVar150 = auVar97._0_4_;
            fVar135 = auVar97._4_4_;
            fVar136 = auVar97._8_4_;
            fVar137 = auVar97._12_4_;
            fVar172 = auVar97._16_4_;
            fVar175 = auVar97._20_4_;
            fVar70 = auVar97._24_4_;
            auVar43._4_4_ = fVar135 * fVar135 * fVar135 * auVar197._4_4_ * -0.5;
            auVar43._0_4_ = fVar150 * fVar150 * fVar150 * auVar197._0_4_ * -0.5;
            auVar43._8_4_ = fVar136 * fVar136 * fVar136 * auVar197._8_4_ * -0.5;
            auVar43._12_4_ = fVar137 * fVar137 * fVar137 * auVar197._12_4_ * -0.5;
            auVar43._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
            auVar43._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar43._24_4_ = fVar70 * fVar70 * fVar70 * -0.0;
            auVar43._28_4_ = auVar108._28_4_;
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar97 = vfmadd231ps_avx512vl(auVar43,auVar93,auVar97);
            auVar44._4_4_ = auVar108._4_4_ * auVar97._4_4_;
            auVar44._0_4_ = auVar108._0_4_ * auVar97._0_4_;
            auVar44._8_4_ = auVar108._8_4_ * auVar97._8_4_;
            auVar44._12_4_ = auVar108._12_4_ * auVar97._12_4_;
            auVar44._16_4_ = auVar108._16_4_ * auVar97._16_4_;
            auVar44._20_4_ = auVar108._20_4_ * auVar97._20_4_;
            auVar44._24_4_ = auVar108._24_4_ * auVar97._24_4_;
            auVar44._28_4_ = 0;
            auVar45._4_4_ = auVar97._4_4_ * -auVar107._4_4_;
            auVar45._0_4_ = auVar97._0_4_ * -auVar107._0_4_;
            auVar45._8_4_ = auVar97._8_4_ * -auVar107._8_4_;
            auVar45._12_4_ = auVar97._12_4_ * -auVar107._12_4_;
            auVar45._16_4_ = auVar97._16_4_ * -auVar107._16_4_;
            auVar45._20_4_ = auVar97._20_4_ * -auVar107._20_4_;
            auVar45._24_4_ = auVar97._24_4_ * -auVar107._24_4_;
            auVar45._28_4_ = auVar108._28_4_;
            auVar92 = vmulps_avx512vl(auVar97,auVar89);
            auVar97 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar89);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar110);
            auVar91 = vrsqrt14ps_avx512vl(auVar97);
            auVar97 = vmulps_avx512vl(auVar97,auVar192);
            fVar150 = auVar91._0_4_;
            fVar135 = auVar91._4_4_;
            fVar136 = auVar91._8_4_;
            fVar137 = auVar91._12_4_;
            fVar172 = auVar91._16_4_;
            fVar175 = auVar91._20_4_;
            fVar70 = auVar91._24_4_;
            auVar46._4_4_ = fVar135 * fVar135 * fVar135 * auVar97._4_4_;
            auVar46._0_4_ = fVar150 * fVar150 * fVar150 * auVar97._0_4_;
            auVar46._8_4_ = fVar136 * fVar136 * fVar136 * auVar97._8_4_;
            auVar46._12_4_ = fVar137 * fVar137 * fVar137 * auVar97._12_4_;
            auVar46._16_4_ = fVar172 * fVar172 * fVar172 * auVar97._16_4_;
            auVar46._20_4_ = fVar175 * fVar175 * fVar175 * auVar97._20_4_;
            auVar46._24_4_ = fVar70 * fVar70 * fVar70 * auVar97._24_4_;
            auVar46._28_4_ = auVar97._28_4_;
            auVar97 = vfmadd231ps_avx512vl(auVar46,auVar93,auVar91);
            auVar47._4_4_ = auVar110._4_4_ * auVar97._4_4_;
            auVar47._0_4_ = auVar110._0_4_ * auVar97._0_4_;
            auVar47._8_4_ = auVar110._8_4_ * auVar97._8_4_;
            auVar47._12_4_ = auVar110._12_4_ * auVar97._12_4_;
            auVar47._16_4_ = auVar110._16_4_ * auVar97._16_4_;
            auVar47._20_4_ = auVar110._20_4_ * auVar97._20_4_;
            auVar47._24_4_ = auVar110._24_4_ * auVar97._24_4_;
            auVar47._28_4_ = auVar91._28_4_;
            auVar48._4_4_ = auVar97._4_4_ * auVar95._4_4_;
            auVar48._0_4_ = auVar97._0_4_ * auVar95._0_4_;
            auVar48._8_4_ = auVar97._8_4_ * auVar95._8_4_;
            auVar48._12_4_ = auVar97._12_4_ * auVar95._12_4_;
            auVar48._16_4_ = auVar97._16_4_ * auVar95._16_4_;
            auVar48._20_4_ = auVar97._20_4_ * auVar95._20_4_;
            auVar48._24_4_ = auVar97._24_4_ * auVar95._24_4_;
            auVar48._28_4_ = auVar95._28_4_;
            auVar95 = vmulps_avx512vl(auVar97,auVar89);
            auVar197 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar76),auVar84);
            auVar97 = ZEXT1632(auVar76);
            auVar196 = vfmadd213ps_fma(auVar45,auVar97,auVar86);
            auVar93 = vfmadd213ps_avx512vl(auVar92,auVar97,auVar81);
            auVar91 = vfmadd213ps_avx512vl(auVar47,ZEXT1632(auVar75),auVar87);
            auVar25 = vfnmadd213ps_fma(auVar44,auVar97,auVar84);
            auVar82 = ZEXT1632(auVar75);
            auVar21 = vfmadd213ps_fma(auVar48,auVar82,auVar88);
            auVar77 = vfnmadd213ps_fma(auVar45,auVar97,auVar86);
            auVar22 = vfmadd213ps_fma(auVar95,auVar82,auVar80);
            auVar86 = ZEXT1632(auVar76);
            auVar30 = vfnmadd231ps_fma(auVar81,auVar86,auVar92);
            auVar78 = vfnmadd213ps_fma(auVar47,auVar82,auVar87);
            auVar29 = vfnmadd213ps_fma(auVar48,auVar82,auVar88);
            auVar79 = vfnmadd231ps_fma(auVar80,ZEXT1632(auVar75),auVar95);
            auVar80 = vsubps_avx512vl(auVar91,ZEXT1632(auVar25));
            auVar95 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar77));
            auVar97 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar30));
            auVar49._4_4_ = auVar95._4_4_ * auVar30._4_4_;
            auVar49._0_4_ = auVar95._0_4_ * auVar30._0_4_;
            auVar49._8_4_ = auVar95._8_4_ * auVar30._8_4_;
            auVar49._12_4_ = auVar95._12_4_ * auVar30._12_4_;
            auVar49._16_4_ = auVar95._16_4_ * 0.0;
            auVar49._20_4_ = auVar95._20_4_ * 0.0;
            auVar49._24_4_ = auVar95._24_4_ * 0.0;
            auVar49._28_4_ = auVar92._28_4_;
            auVar76 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar77),auVar97);
            auVar50._4_4_ = auVar97._4_4_ * auVar25._4_4_;
            auVar50._0_4_ = auVar97._0_4_ * auVar25._0_4_;
            auVar50._8_4_ = auVar97._8_4_ * auVar25._8_4_;
            auVar50._12_4_ = auVar97._12_4_ * auVar25._12_4_;
            auVar50._16_4_ = auVar97._16_4_ * 0.0;
            auVar50._20_4_ = auVar97._20_4_ * 0.0;
            auVar50._24_4_ = auVar97._24_4_ * 0.0;
            auVar50._28_4_ = auVar97._28_4_;
            auVar23 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar30),auVar80);
            auVar51._4_4_ = auVar77._4_4_ * auVar80._4_4_;
            auVar51._0_4_ = auVar77._0_4_ * auVar80._0_4_;
            auVar51._8_4_ = auVar77._8_4_ * auVar80._8_4_;
            auVar51._12_4_ = auVar77._12_4_ * auVar80._12_4_;
            auVar51._16_4_ = auVar80._16_4_ * 0.0;
            auVar51._20_4_ = auVar80._20_4_ * 0.0;
            auVar51._24_4_ = auVar80._24_4_ * 0.0;
            auVar51._28_4_ = auVar80._28_4_;
            auVar24 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar25),auVar95);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar89,ZEXT1632(auVar23));
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar76));
            uVar62 = vcmpps_avx512vl(auVar95,auVar89,2);
            bVar61 = (byte)uVar62;
            fVar118 = (float)((uint)(bVar61 & 1) * auVar197._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar78._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar120 = (float)((uint)bVar13 * auVar197._4_4_ | (uint)!bVar13 * auVar78._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar123 = (float)((uint)bVar13 * auVar197._8_4_ | (uint)!bVar13 * auVar78._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar124 = (float)((uint)bVar13 * auVar197._12_4_ | (uint)!bVar13 * auVar78._12_4_);
            auVar82 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar123,CONCAT44(fVar120,fVar118))));
            fVar119 = (float)((uint)(bVar61 & 1) * auVar196._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar29._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar122 = (float)((uint)bVar13 * auVar196._4_4_ | (uint)!bVar13 * auVar29._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar121 = (float)((uint)bVar13 * auVar196._8_4_ | (uint)!bVar13 * auVar29._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar125 = (float)((uint)bVar13 * auVar196._12_4_ | (uint)!bVar13 * auVar29._12_4_);
            auVar85 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar121,CONCAT44(fVar122,fVar119))));
            auVar111._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar79._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar79._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar79._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar79._12_4_);
            fVar150 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar93._16_4_);
            auVar111._16_4_ = fVar150;
            fVar135 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar93._20_4_);
            auVar111._20_4_ = fVar135;
            fVar136 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar93._24_4_);
            auVar111._24_4_ = fVar136;
            iVar1 = (uint)(byte)(uVar62 >> 7) * auVar93._28_4_;
            auVar111._28_4_ = iVar1;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar91);
            auVar112._0_4_ =
                 (uint)(bVar61 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar76._0_4_;
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar76._4_4_;
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar76._8_4_;
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar76._12_4_;
            auVar112._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar95._16_4_;
            auVar112._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar95._20_4_;
            auVar112._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar95._24_4_;
            auVar112._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar95._28_4_;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar21));
            auVar113._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar197._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar197._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar197._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar197._12_4_);
            fVar175 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar95._16_4_);
            auVar113._16_4_ = fVar175;
            fVar172 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar95._20_4_);
            auVar113._20_4_ = fVar172;
            fVar137 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar95._24_4_);
            auVar113._24_4_ = fVar137;
            auVar113._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar95._28_4_;
            auVar95 = vblendmps_avx512vl(ZEXT1632(auVar30),ZEXT1632(auVar22));
            auVar114._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar196._0_4_);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar13 * auVar95._4_4_ | (uint)!bVar13 * auVar196._4_4_);
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar13 * auVar95._8_4_ | (uint)!bVar13 * auVar196._8_4_);
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar13 * auVar95._12_4_ | (uint)!bVar13 * auVar196._12_4_);
            fVar117 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar95._16_4_);
            auVar114._16_4_ = fVar117;
            fVar71 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar95._20_4_);
            auVar114._20_4_ = fVar71;
            fVar70 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar95._24_4_);
            auVar114._24_4_ = fVar70;
            iVar2 = (uint)(byte)(uVar62 >> 7) * auVar95._28_4_;
            auVar114._28_4_ = iVar2;
            auVar115._0_4_ =
                 (uint)(bVar61 & 1) * (int)auVar25._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar91._0_4_
            ;
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar13 * (int)auVar25._4_4_ | (uint)!bVar13 * auVar91._4_4_;
            bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar13 * (int)auVar25._8_4_ | (uint)!bVar13 * auVar91._8_4_;
            bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar13 * (int)auVar25._12_4_ | (uint)!bVar13 * auVar91._12_4_;
            auVar115._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar91._16_4_;
            auVar115._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar91._20_4_;
            auVar115._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar91._24_4_;
            auVar115._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar91._28_4_;
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar62 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar91 = vsubps_avx512vl(auVar115,auVar82);
            auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar77._12_4_ |
                                                    (uint)!bVar17 * auVar21._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar77._8_4_ |
                                                             (uint)!bVar15 * auVar21._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar77._4_4_ |
                                                                      (uint)!bVar13 * auVar21._4_4_,
                                                                      (uint)(bVar61 & 1) *
                                                                      (int)auVar77._0_4_ |
                                                                      (uint)!(bool)(bVar61 & 1) *
                                                                      auVar21._0_4_)))),auVar85);
            auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar30._12_4_ |
                                                    (uint)!bVar18 * auVar22._12_4_,
                                                    CONCAT48((uint)bVar16 * (int)auVar30._8_4_ |
                                                             (uint)!bVar16 * auVar22._8_4_,
                                                             CONCAT44((uint)bVar14 *
                                                                      (int)auVar30._4_4_ |
                                                                      (uint)!bVar14 * auVar22._4_4_,
                                                                      (uint)(bVar61 & 1) *
                                                                      (int)auVar30._0_4_ |
                                                                      (uint)!(bool)(bVar61 & 1) *
                                                                      auVar22._0_4_)))),auVar111);
            auVar92 = vsubps_avx(auVar82,auVar112);
            auVar80 = vsubps_avx(auVar85,auVar113);
            auVar81 = vsubps_avx(auVar111,auVar114);
            auVar52._4_4_ = auVar93._4_4_ * fVar120;
            auVar52._0_4_ = auVar93._0_4_ * fVar118;
            auVar52._8_4_ = auVar93._8_4_ * fVar123;
            auVar52._12_4_ = auVar93._12_4_ * fVar124;
            auVar52._16_4_ = auVar93._16_4_ * 0.0;
            auVar52._20_4_ = auVar93._20_4_ * 0.0;
            auVar52._24_4_ = auVar93._24_4_ * 0.0;
            auVar52._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar52,auVar111,auVar91);
            auVar156._0_4_ = fVar119 * auVar91._0_4_;
            auVar156._4_4_ = fVar122 * auVar91._4_4_;
            auVar156._8_4_ = fVar121 * auVar91._8_4_;
            auVar156._12_4_ = fVar125 * auVar91._12_4_;
            auVar156._16_4_ = auVar91._16_4_ * 0.0;
            auVar156._20_4_ = auVar91._20_4_ * 0.0;
            auVar156._24_4_ = auVar91._24_4_ * 0.0;
            auVar156._28_4_ = 0;
            auVar197 = vfmsub231ps_fma(auVar156,auVar82,auVar97);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar197),auVar89,ZEXT1632(auVar76));
            auVar162._0_4_ = auVar97._0_4_ * auVar111._0_4_;
            auVar162._4_4_ = auVar97._4_4_ * auVar111._4_4_;
            auVar162._8_4_ = auVar97._8_4_ * auVar111._8_4_;
            auVar162._12_4_ = auVar97._12_4_ * auVar111._12_4_;
            auVar162._16_4_ = auVar97._16_4_ * fVar150;
            auVar162._20_4_ = auVar97._20_4_ * fVar135;
            auVar162._24_4_ = auVar97._24_4_ * fVar136;
            auVar162._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar162,auVar85,auVar93);
            auVar83 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar76));
            auVar95 = vmulps_avx512vl(auVar81,auVar112);
            auVar95 = vfmsub231ps_avx512vl(auVar95,auVar92,auVar114);
            auVar53._4_4_ = auVar80._4_4_ * auVar114._4_4_;
            auVar53._0_4_ = auVar80._0_4_ * auVar114._0_4_;
            auVar53._8_4_ = auVar80._8_4_ * auVar114._8_4_;
            auVar53._12_4_ = auVar80._12_4_ * auVar114._12_4_;
            auVar53._16_4_ = auVar80._16_4_ * fVar117;
            auVar53._20_4_ = auVar80._20_4_ * fVar71;
            auVar53._24_4_ = auVar80._24_4_ * fVar70;
            auVar53._28_4_ = iVar2;
            auVar76 = vfmsub231ps_fma(auVar53,auVar113,auVar81);
            auVar163._0_4_ = auVar113._0_4_ * auVar92._0_4_;
            auVar163._4_4_ = auVar113._4_4_ * auVar92._4_4_;
            auVar163._8_4_ = auVar113._8_4_ * auVar92._8_4_;
            auVar163._12_4_ = auVar113._12_4_ * auVar92._12_4_;
            auVar163._16_4_ = fVar175 * auVar92._16_4_;
            auVar163._20_4_ = fVar172 * auVar92._20_4_;
            auVar163._24_4_ = fVar137 * auVar92._24_4_;
            auVar163._28_4_ = 0;
            auVar197 = vfmsub231ps_fma(auVar163,auVar80,auVar112);
            auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar197),auVar89,auVar95);
            auVar84 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar76));
            auVar95 = vmaxps_avx(auVar83,auVar84);
            uVar138 = vcmpps_avx512vl(auVar95,auVar89,2);
            bVar69 = bVar69 & (byte)uVar138;
            if (bVar69 != 0) {
              uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar189._4_4_ = uVar126;
              auVar189._0_4_ = uVar126;
              auVar189._8_4_ = uVar126;
              auVar189._12_4_ = uVar126;
              auVar189._16_4_ = uVar126;
              auVar189._20_4_ = uVar126;
              auVar189._24_4_ = uVar126;
              auVar189._28_4_ = uVar126;
              auVar193 = ZEXT3264(auVar189);
              auVar54._4_4_ = auVar81._4_4_ * auVar97._4_4_;
              auVar54._0_4_ = auVar81._0_4_ * auVar97._0_4_;
              auVar54._8_4_ = auVar81._8_4_ * auVar97._8_4_;
              auVar54._12_4_ = auVar81._12_4_ * auVar97._12_4_;
              auVar54._16_4_ = auVar81._16_4_ * auVar97._16_4_;
              auVar54._20_4_ = auVar81._20_4_ * auVar97._20_4_;
              auVar54._24_4_ = auVar81._24_4_ * auVar97._24_4_;
              auVar54._28_4_ = auVar95._28_4_;
              auVar196 = vfmsub231ps_fma(auVar54,auVar80,auVar93);
              auVar55._4_4_ = auVar93._4_4_ * auVar92._4_4_;
              auVar55._0_4_ = auVar93._0_4_ * auVar92._0_4_;
              auVar55._8_4_ = auVar93._8_4_ * auVar92._8_4_;
              auVar55._12_4_ = auVar93._12_4_ * auVar92._12_4_;
              auVar55._16_4_ = auVar93._16_4_ * auVar92._16_4_;
              auVar55._20_4_ = auVar93._20_4_ * auVar92._20_4_;
              auVar55._24_4_ = auVar93._24_4_ * auVar92._24_4_;
              auVar55._28_4_ = auVar93._28_4_;
              auVar197 = vfmsub231ps_fma(auVar55,auVar91,auVar81);
              auVar56._4_4_ = auVar80._4_4_ * auVar91._4_4_;
              auVar56._0_4_ = auVar80._0_4_ * auVar91._0_4_;
              auVar56._8_4_ = auVar80._8_4_ * auVar91._8_4_;
              auVar56._12_4_ = auVar80._12_4_ * auVar91._12_4_;
              auVar56._16_4_ = auVar80._16_4_ * auVar91._16_4_;
              auVar56._20_4_ = auVar80._20_4_ * auVar91._20_4_;
              auVar56._24_4_ = auVar80._24_4_ * auVar91._24_4_;
              auVar56._28_4_ = auVar80._28_4_;
              auVar21 = vfmsub231ps_fma(auVar56,auVar92,auVar97);
              auVar76 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar197),ZEXT1632(auVar21));
              auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar196),auVar89);
              auVar97 = vrcp14ps_avx512vl(auVar95);
              auVar92 = auVar195._0_32_;
              auVar93 = vfnmadd213ps_avx512vl(auVar97,auVar95,auVar92);
              auVar76 = vfmadd132ps_fma(auVar93,auVar97,auVar97);
              auVar57._4_4_ = auVar21._4_4_ * auVar111._4_4_;
              auVar57._0_4_ = auVar21._0_4_ * auVar111._0_4_;
              auVar57._8_4_ = auVar21._8_4_ * auVar111._8_4_;
              auVar57._12_4_ = auVar21._12_4_ * auVar111._12_4_;
              auVar57._16_4_ = fVar150 * 0.0;
              auVar57._20_4_ = fVar135 * 0.0;
              auVar57._24_4_ = fVar136 * 0.0;
              auVar57._28_4_ = iVar1;
              auVar197 = vfmadd231ps_fma(auVar57,auVar85,ZEXT1632(auVar197));
              auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar82,ZEXT1632(auVar196));
              fVar150 = auVar76._0_4_;
              fVar135 = auVar76._4_4_;
              fVar136 = auVar76._8_4_;
              fVar137 = auVar76._12_4_;
              local_380 = ZEXT1632(CONCAT412(auVar197._12_4_ * fVar137,
                                             CONCAT48(auVar197._8_4_ * fVar136,
                                                      CONCAT44(auVar197._4_4_ * fVar135,
                                                               auVar197._0_4_ * fVar150))));
              uVar138 = vcmpps_avx512vl(local_380,auVar189,2);
              auVar59._4_4_ = uStack_47c;
              auVar59._0_4_ = local_480;
              auVar59._8_4_ = uStack_478;
              auVar59._12_4_ = uStack_474;
              auVar59._16_4_ = uStack_470;
              auVar59._20_4_ = uStack_46c;
              auVar59._24_4_ = uStack_468;
              auVar59._28_4_ = uStack_464;
              uVar26 = vcmpps_avx512vl(local_380,auVar59,0xd);
              bVar69 = (byte)uVar138 & (byte)uVar26 & bVar69;
              if (bVar69 != 0) {
                uVar138 = vcmpps_avx512vl(auVar95,auVar89,4);
                bVar69 = bVar69 & (byte)uVar138;
                if (bVar69 != 0) {
                  fVar172 = auVar83._0_4_ * fVar150;
                  fVar175 = auVar83._4_4_ * fVar135;
                  auVar58._4_4_ = fVar175;
                  auVar58._0_4_ = fVar172;
                  fVar70 = auVar83._8_4_ * fVar136;
                  auVar58._8_4_ = fVar70;
                  fVar71 = auVar83._12_4_ * fVar137;
                  auVar58._12_4_ = fVar71;
                  fVar117 = auVar83._16_4_ * 0.0;
                  auVar58._16_4_ = fVar117;
                  fVar118 = auVar83._20_4_ * 0.0;
                  auVar58._20_4_ = fVar118;
                  fVar119 = auVar83._24_4_ * 0.0;
                  auVar58._24_4_ = fVar119;
                  auVar58._28_4_ = auVar95._28_4_;
                  auVar97 = vsubps_avx512vl(auVar92,auVar58);
                  local_3c0._0_4_ =
                       (float)((uint)(bVar61 & 1) * (int)fVar172 |
                              (uint)!(bool)(bVar61 & 1) * auVar97._0_4_);
                  bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
                  local_3c0._4_4_ =
                       (float)((uint)bVar13 * (int)fVar175 | (uint)!bVar13 * auVar97._4_4_);
                  bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
                  local_3c0._8_4_ =
                       (float)((uint)bVar13 * (int)fVar70 | (uint)!bVar13 * auVar97._8_4_);
                  bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
                  local_3c0._12_4_ =
                       (float)((uint)bVar13 * (int)fVar71 | (uint)!bVar13 * auVar97._12_4_);
                  bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                  local_3c0._16_4_ =
                       (float)((uint)bVar13 * (int)fVar117 | (uint)!bVar13 * auVar97._16_4_);
                  bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
                  local_3c0._20_4_ =
                       (float)((uint)bVar13 * (int)fVar118 | (uint)!bVar13 * auVar97._20_4_);
                  bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
                  local_3c0._24_4_ =
                       (float)((uint)bVar13 * (int)fVar119 | (uint)!bVar13 * auVar97._24_4_);
                  bVar13 = SUB81(uVar62 >> 7,0);
                  local_3c0._28_4_ =
                       (float)((uint)bVar13 * auVar95._28_4_ | (uint)!bVar13 * auVar97._28_4_);
                  auVar95 = vsubps_avx(ZEXT1632(auVar75),auVar86);
                  auVar76 = vfmadd213ps_fma(auVar95,local_3c0,auVar86);
                  uVar126 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar34._4_4_ = uVar126;
                  auVar34._0_4_ = uVar126;
                  auVar34._8_4_ = uVar126;
                  auVar34._12_4_ = uVar126;
                  auVar34._16_4_ = uVar126;
                  auVar34._20_4_ = uVar126;
                  auVar34._24_4_ = uVar126;
                  auVar34._28_4_ = uVar126;
                  auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                                               CONCAT48(auVar76._8_4_ +
                                                                        auVar76._8_4_,
                                                                        CONCAT44(auVar76._4_4_ +
                                                                                 auVar76._4_4_,
                                                                                 auVar76._0_4_ +
                                                                                 auVar76._0_4_)))),
                                            auVar34);
                  uVar138 = vcmpps_avx512vl(local_380,auVar95,6);
                  if (((byte)uVar138 & bVar69) != 0) {
                    auVar144._0_4_ = auVar84._0_4_ * fVar150;
                    auVar144._4_4_ = auVar84._4_4_ * fVar135;
                    auVar144._8_4_ = auVar84._8_4_ * fVar136;
                    auVar144._12_4_ = auVar84._12_4_ * fVar137;
                    auVar144._16_4_ = auVar84._16_4_ * 0.0;
                    auVar144._20_4_ = auVar84._20_4_ * 0.0;
                    auVar144._24_4_ = auVar84._24_4_ * 0.0;
                    auVar144._28_4_ = 0;
                    auVar95 = vsubps_avx512vl(auVar92,auVar144);
                    auVar116._0_4_ =
                         (uint)(bVar61 & 1) * (int)auVar144._0_4_ |
                         (uint)!(bool)(bVar61 & 1) * auVar95._0_4_;
                    bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
                    auVar116._4_4_ =
                         (uint)bVar13 * (int)auVar144._4_4_ | (uint)!bVar13 * auVar95._4_4_;
                    bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
                    auVar116._8_4_ =
                         (uint)bVar13 * (int)auVar144._8_4_ | (uint)!bVar13 * auVar95._8_4_;
                    bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
                    auVar116._12_4_ =
                         (uint)bVar13 * (int)auVar144._12_4_ | (uint)!bVar13 * auVar95._12_4_;
                    bVar13 = (bool)((byte)(uVar62 >> 4) & 1);
                    auVar116._16_4_ =
                         (uint)bVar13 * (int)auVar144._16_4_ | (uint)!bVar13 * auVar95._16_4_;
                    bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
                    auVar116._20_4_ =
                         (uint)bVar13 * (int)auVar144._20_4_ | (uint)!bVar13 * auVar95._20_4_;
                    bVar13 = (bool)((byte)(uVar62 >> 6) & 1);
                    auVar116._24_4_ =
                         (uint)bVar13 * (int)auVar144._24_4_ | (uint)!bVar13 * auVar95._24_4_;
                    auVar116._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar95._28_4_;
                    auVar35._8_4_ = 0x40000000;
                    auVar35._0_8_ = 0x4000000040000000;
                    auVar35._12_4_ = 0x40000000;
                    auVar35._16_4_ = 0x40000000;
                    auVar35._20_4_ = 0x40000000;
                    auVar35._24_4_ = 0x40000000;
                    auVar35._28_4_ = 0x40000000;
                    local_3a0 = vfmsub132ps_avx512vl(auVar116,auVar92,auVar35);
                    local_360 = (undefined4)lVar67;
                    local_350 = local_670._0_8_;
                    uStack_348 = local_670._8_8_;
                    local_340 = local_680._0_8_;
                    uStack_338 = local_680._8_8_;
                    local_330 = local_690._0_8_;
                    uStack_328 = local_690._8_8_;
                    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar61 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar61 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar76 = vcvtsi2ss_avx512f(auVar90._0_16_,local_360);
                      fVar150 = auVar76._0_4_;
                      local_300[0] = (fVar150 + local_3c0._0_4_ + 0.0) * (float)local_420._0_4_;
                      local_300[1] = (fVar150 + local_3c0._4_4_ + 1.0) * (float)local_420._4_4_;
                      local_300[2] = (fVar150 + local_3c0._8_4_ + 2.0) * fStack_418;
                      local_300[3] = (fVar150 + local_3c0._12_4_ + 3.0) * fStack_414;
                      fStack_2f0 = (fVar150 + local_3c0._16_4_ + 4.0) * fStack_410;
                      fStack_2ec = (fVar150 + local_3c0._20_4_ + 5.0) * fStack_40c;
                      fStack_2e8 = (fVar150 + local_3c0._24_4_ + 6.0) * fStack_408;
                      fStack_2e4 = fVar150 + local_3c0._28_4_ + 7.0;
                      local_2e0 = local_3a0;
                      local_2c0 = local_380;
                      uVar62 = CONCAT71(0,(byte)uVar138 & bVar69);
                      local_6f0._0_8_ = uVar62;
                      lVar11 = 0;
                      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                        lVar11 = lVar11 + 1;
                      }
                      local_4c0._0_8_ = lVar11;
                      local_560._0_4_ = (int)uVar64;
                      local_2a0 = auVar189;
                      local_35c = iVar8;
                      do {
                        auVar197 = auVar198._0_16_;
                        local_200 = local_300[local_4c0._0_8_];
                        local_1e0 = *(undefined4 *)(local_2e0 + local_4c0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2c0 + local_4c0._0_8_ * 4);
                        local_6c0.context = context->user;
                        fVar135 = 1.0 - local_200;
                        fVar150 = fVar135 * fVar135 * -3.0;
                        auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135)),
                                                  ZEXT416((uint)(local_200 * fVar135)),
                                                  ZEXT416(0xc0000000));
                        auVar75 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar135)),
                                                  ZEXT416((uint)(local_200 * local_200)),
                                                  ZEXT416(0x40000000));
                        fVar135 = auVar76._0_4_ * 3.0;
                        fVar136 = auVar75._0_4_ * 3.0;
                        fVar137 = local_200 * local_200 * 3.0;
                        auVar169._0_4_ = fVar137 * (float)local_490._0_4_;
                        auVar169._4_4_ = fVar137 * (float)local_490._4_4_;
                        auVar169._8_4_ = fVar137 * fStack_488;
                        auVar169._12_4_ = fVar137 * fStack_484;
                        auVar133._4_4_ = fVar136;
                        auVar133._0_4_ = fVar136;
                        auVar133._8_4_ = fVar136;
                        auVar133._12_4_ = fVar136;
                        auVar76 = vfmadd132ps_fma(auVar133,auVar169,local_690);
                        auVar154._4_4_ = fVar135;
                        auVar154._0_4_ = fVar135;
                        auVar154._8_4_ = fVar135;
                        auVar154._12_4_ = fVar135;
                        auVar76 = vfmadd132ps_fma(auVar154,auVar76,local_680);
                        auVar134._4_4_ = fVar150;
                        auVar134._0_4_ = fVar150;
                        auVar134._8_4_ = fVar150;
                        auVar134._12_4_ = fVar150;
                        auVar76 = vfmadd132ps_fma(auVar134,auVar76,local_670);
                        local_260 = auVar76._0_4_;
                        auVar164._8_4_ = 1;
                        auVar164._0_8_ = 0x100000001;
                        auVar164._12_4_ = 1;
                        auVar164._16_4_ = 1;
                        auVar164._20_4_ = 1;
                        auVar164._24_4_ = 1;
                        auVar164._28_4_ = 1;
                        local_240 = vpermps_avx2(auVar164,ZEXT1632(auVar76));
                        auVar171._8_4_ = 2;
                        auVar171._0_8_ = 0x200000002;
                        auVar171._12_4_ = 2;
                        auVar171._16_4_ = 2;
                        auVar171._20_4_ = 2;
                        auVar171._24_4_ = 2;
                        auVar171._28_4_ = 2;
                        local_220 = vpermps_avx2(auVar171,ZEXT1632(auVar76));
                        uStack_25c = local_260;
                        uStack_258 = local_260;
                        uStack_254 = local_260;
                        uStack_250 = local_260;
                        uStack_24c = local_260;
                        uStack_248 = local_260;
                        uStack_244 = local_260;
                        fStack_1fc = local_200;
                        fStack_1f8 = local_200;
                        fStack_1f4 = local_200;
                        fStack_1f0 = local_200;
                        fStack_1ec = local_200;
                        fStack_1e8 = local_200;
                        fStack_1e4 = local_200;
                        uStack_1dc = local_1e0;
                        uStack_1d8 = local_1e0;
                        uStack_1d4 = local_1e0;
                        uStack_1d0 = local_1e0;
                        uStack_1cc = local_1e0;
                        uStack_1c8 = local_1e0;
                        uStack_1c4 = local_1e0;
                        local_1c0 = local_440._0_8_;
                        uStack_1b8 = local_440._8_8_;
                        uStack_1b0 = local_440._16_8_;
                        uStack_1a8 = local_440._24_8_;
                        local_1a0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_180 = (local_6c0.context)->instID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = (local_6c0.context)->instPrimID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_660 = local_280;
                        local_6c0.valid = (int *)local_660;
                        local_6c0.geometryUserPtr = pGVar9->userPtr;
                        local_6c0.hit = (RTCHitN *)&local_260;
                        local_6c0.N = 8;
                        local_6c0.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_6c0);
                          auVar193 = ZEXT3264(local_2a0);
                          uVar64 = (ulong)(uint)local_560._0_4_;
                          auVar206 = ZEXT3264(local_540);
                          auVar205 = ZEXT3264(local_520);
                          auVar204 = ZEXT3264(local_5e0);
                          auVar203 = ZEXT3264(local_5c0);
                          auVar202 = ZEXT3264(local_500);
                          auVar201 = ZEXT3264(local_5a0);
                          auVar200 = ZEXT3264(local_4e0);
                          auVar199 = ZEXT3264(local_580);
                          auVar76 = vxorps_avx512vl(auVar197,auVar197);
                          auVar198 = ZEXT1664(auVar76);
                        }
                        auVar76 = auVar198._0_16_;
                        if (local_660 == (undefined1  [32])0x0) {
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar95);
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var12)(&local_6c0);
                            auVar193 = ZEXT3264(local_2a0);
                            uVar64 = (ulong)(uint)local_560._0_4_;
                            auVar206 = ZEXT3264(local_540);
                            auVar205 = ZEXT3264(local_520);
                            auVar204 = ZEXT3264(local_5e0);
                            auVar203 = ZEXT3264(local_5c0);
                            auVar202 = ZEXT3264(local_500);
                            auVar201 = ZEXT3264(local_5a0);
                            auVar200 = ZEXT3264(local_4e0);
                            auVar199 = ZEXT3264(local_580);
                            auVar76 = vxorps_avx512vl(auVar76,auVar76);
                            auVar198 = ZEXT1664(auVar76);
                          }
                          uVar62 = vptestmd_avx512vl(local_660,local_660);
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar13 = (bool)((byte)uVar62 & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar20 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_6c0.ray + 0x100) =
                               (uint)bVar13 * auVar95._0_4_ |
                               (uint)!bVar13 * *(int *)(local_6c0.ray + 0x100);
                          *(uint *)(local_6c0.ray + 0x104) =
                               (uint)bVar14 * auVar95._4_4_ |
                               (uint)!bVar14 * *(int *)(local_6c0.ray + 0x104);
                          *(uint *)(local_6c0.ray + 0x108) =
                               (uint)bVar15 * auVar95._8_4_ |
                               (uint)!bVar15 * *(int *)(local_6c0.ray + 0x108);
                          *(uint *)(local_6c0.ray + 0x10c) =
                               (uint)bVar16 * auVar95._12_4_ |
                               (uint)!bVar16 * *(int *)(local_6c0.ray + 0x10c);
                          *(uint *)(local_6c0.ray + 0x110) =
                               (uint)bVar17 * auVar95._16_4_ |
                               (uint)!bVar17 * *(int *)(local_6c0.ray + 0x110);
                          *(uint *)(local_6c0.ray + 0x114) =
                               (uint)bVar18 * auVar95._20_4_ |
                               (uint)!bVar18 * *(int *)(local_6c0.ray + 0x114);
                          *(uint *)(local_6c0.ray + 0x118) =
                               (uint)bVar19 * auVar95._24_4_ |
                               (uint)!bVar19 * *(int *)(local_6c0.ray + 0x118);
                          *(uint *)(local_6c0.ray + 0x11c) =
                               (uint)bVar20 * auVar95._28_4_ |
                               (uint)!bVar20 * *(int *)(local_6c0.ray + 0x11c);
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar195 = ZEXT3264(auVar95);
                          if (local_660 != (undefined1  [32])0x0) {
                            bVar61 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar193._0_4_;
                        uVar65 = local_6f0._0_8_ ^ 1L << (local_4c0._0_8_ & 0x3f);
                        bVar61 = 0;
                        local_6f0._0_8_ = uVar65;
                        lVar11 = 0;
                        for (uVar62 = uVar65; (uVar62 & 1) == 0;
                            uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                          lVar11 = lVar11 + 1;
                        }
                        local_4c0._0_8_ = lVar11;
                      } while (uVar65 != 0);
                    }
                    uVar64 = CONCAT71((int7)(uVar64 >> 8),(byte)uVar64 | bVar61);
                  }
                }
              }
            }
          }
          lVar67 = lVar67 + 8;
        } while ((int)lVar67 < iVar8);
      }
      bVar69 = (byte)uVar64;
      if ((uVar64 & 1) != 0) break;
      uVar126 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar126;
      auVar32._0_4_ = uVar126;
      auVar32._8_4_ = uVar126;
      auVar32._12_4_ = uVar126;
      uVar138 = vcmpps_avx512vl(local_3d0,auVar32,2);
      uVar66 = (uint)uVar68 & (uint)uVar68 + 0xf & (uint)uVar138;
      uVar68 = (ulong)uVar66;
    } while (uVar66 != 0);
  }
  return (bool)(bVar69 & 1);
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }